

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_light.cpp
# Opt level: O0

Light_SampleRes * embree::PointLight_sample(Light *super,DifferentialGeometry *dg,Vec2f *s)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 uVar13;
  undefined4 *in_RCX;
  long in_RDX;
  long in_RSI;
  Light_SampleRes *in_RDI;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  Vec3fa localDir_1;
  float c_2;
  Vec3fa localDir;
  float cosTheta;
  float sinTheta;
  float invdist;
  float dist2;
  Vec3fa dir;
  PointLight *self;
  Light_SampleRes *res;
  __m128 c_1;
  __m128 r;
  __m128 a_1;
  Vec3fa dy_1;
  Vec3fa dx_1;
  Vec3fa dx1_1;
  Vec3fa dx0_1;
  Vec3fa dy;
  Vec3fa dx;
  Vec3fa dx1;
  Vec3fa dx0;
  __m128 r_5;
  __m128 a_14;
  vfloat4 c_4;
  vfloat4 b_2;
  vfloat4 a_3;
  vfloat4 c_3;
  vfloat4 b_1;
  vfloat4 a_2;
  vfloat4 c_10;
  vfloat4 b_6;
  vfloat4 a_9;
  vfloat4 c_9;
  vfloat4 b_5;
  vfloat4 a_8;
  vfloat4 c;
  vfloat4 b;
  vfloat4 a;
  __m128 c_8;
  __m128 r_2;
  __m128 a_7;
  vfloat4 c_7;
  vfloat4 b_4;
  vfloat4 a_6;
  __m128 c_6;
  __m128 r_1;
  __m128 a_5;
  vfloat4 c_5;
  vfloat4 b_3;
  vfloat4 a_4;
  __m128 c_14;
  __m128 r_4;
  __m128 a_13;
  vfloat4 c_13;
  vfloat4 b_8;
  vfloat4 a_12;
  __m128 c_12;
  __m128 r_3;
  __m128 a_11;
  vfloat4 c_11;
  vfloat4 b_7;
  vfloat4 a_10;
  __m128 mask;
  __m128 mask_1;
  vfloat4 b1;
  vfloat4 a1;
  vfloat4 b0;
  vfloat4 a0;
  vfloat4 b1_1;
  vfloat4 a1_1;
  vfloat4 b0_1;
  vfloat4 a0_1;
  ulong local_3ad8;
  ulong uStackY_3ad0;
  Vec2f *in_stack_ffffffffffffc538;
  float in_stack_ffffffffffffc544;
  ulong local_3ab8;
  Vec2f *in_stack_ffffffffffffc550;
  undefined8 local_3a88;
  undefined8 uStack_3a80;
  undefined1 local_3a78 [16];
  undefined8 local_3a68;
  undefined8 uStack_3a60;
  undefined8 local_3a58;
  undefined8 uStack_3a50;
  undefined4 local_3a40;
  undefined4 local_3a3c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_3a38;
  float local_3a1c;
  undefined8 local_3a18;
  undefined8 uStack_3a10;
  undefined1 local_3a08 [16];
  undefined8 local_39f8;
  undefined8 uStack_39f0;
  undefined8 local_39e8;
  undefined8 uStack_39e0;
  float local_39d8;
  float local_39d4;
  float local_39d0;
  float local_39c0;
  float local_39bc;
  undefined8 local_39b8;
  undefined8 uStack_39b0;
  undefined8 local_39a8;
  undefined8 uStack_39a0;
  float local_3990;
  float local_398c;
  undefined8 local_3988;
  undefined8 uStack_3980;
  long local_3978;
  undefined4 *local_3970;
  long local_3968;
  undefined8 *local_3950;
  undefined8 *local_3948;
  undefined8 *local_3940;
  undefined8 local_3938;
  undefined8 uStack_3930;
  undefined8 *local_3928;
  undefined8 *local_3920;
  ulong local_3918;
  undefined8 uStack_3910;
  undefined1 local_3908 [16];
  ulong local_38f8;
  undefined8 uStack_38f0;
  float local_38dc;
  undefined8 local_38a8;
  undefined8 uStack_38a0;
  float local_388c;
  undefined8 *local_3888;
  undefined8 *local_3880;
  undefined8 local_3878;
  undefined8 uStack_3870;
  float local_385c;
  undefined8 *local_3858;
  undefined8 *local_3850;
  undefined8 *local_3838;
  Vec3fa *local_3830;
  undefined8 *local_3828;
  Vec3fa *local_3820;
  undefined8 *local_3818;
  undefined8 *local_3808;
  Vec3fa *local_3800;
  undefined1 *local_37f8;
  float local_37e8;
  float local_37e4;
  float local_37e0;
  float local_37dc;
  undefined1 local_37d8 [16];
  undefined8 local_37c8;
  undefined8 uStack_37c0;
  undefined1 local_37b8 [16];
  undefined8 local_37a8;
  undefined8 uStack_37a0;
  undefined1 local_3798 [24];
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_3780;
  undefined8 *local_3778;
  undefined8 *local_3770;
  undefined1 local_3768 [16];
  undefined8 local_3758;
  undefined8 uStack_3750;
  undefined1 local_3748 [16];
  undefined8 local_3738;
  undefined8 uStack_3730;
  undefined1 local_3728 [24];
  float *local_3710;
  undefined8 *local_3708;
  undefined8 *local_3700;
  undefined8 local_36f8;
  undefined8 uStack_36f0;
  undefined8 local_36e8;
  undefined8 uStack_36e0;
  ulong local_36d8;
  ulong uStack_36d0;
  undefined8 local_36c8;
  undefined8 uStack_36c0;
  ulong local_36b8;
  ulong uStack_36b0;
  ulong local_36a8;
  ulong uStack_36a0;
  undefined1 (*local_3698) [16];
  undefined8 *local_3690;
  ulong local_3688;
  ulong uStack_3680;
  ulong *local_3678;
  ulong *local_3670;
  long local_3668;
  ulong uStack_3660;
  ulong *local_3658;
  ulong *local_3650;
  undefined8 local_3648;
  undefined8 uStack_3640;
  undefined8 local_3638;
  undefined8 uStack_3630;
  ulong local_3628;
  ulong uStack_3620;
  undefined8 local_3618;
  undefined8 uStack_3610;
  ulong local_3608;
  ulong uStack_3600;
  ulong local_35f8;
  ulong uStack_35f0;
  Vec3fa *local_35e8;
  undefined8 *local_35e0;
  ulong local_35d8;
  ulong uStack_35d0;
  ulong *local_35c8;
  ulong *local_35c0;
  long local_35b8;
  ulong uStack_35b0;
  ulong *local_35a8;
  ulong *local_35a0;
  undefined4 *local_3598;
  undefined4 *local_3590;
  undefined1 *local_3560;
  undefined1 *local_3550;
  undefined1 *local_3540;
  undefined1 *local_3530;
  undefined1 *local_3520;
  undefined1 *local_3510;
  float local_3504;
  undefined8 *local_3500;
  float local_34f4;
  undefined8 *local_34f0;
  undefined8 local_34d8;
  undefined8 uStack_34d0;
  undefined8 local_34c8;
  undefined8 uStack_34c0;
  float local_34b8;
  float fStack_34b4;
  float fStack_34b0;
  float fStack_34ac;
  undefined8 *local_34a0;
  ulong local_3498;
  ulong uStack_3490;
  undefined8 local_3488;
  undefined8 uStack_3480;
  undefined8 local_3478;
  undefined8 uStack_3470;
  undefined8 local_3468;
  undefined8 uStack_3460;
  ulong local_3458;
  ulong uStack_3450;
  ulong *local_3440;
  undefined8 local_3438;
  undefined8 uStack_3430;
  undefined8 local_3428;
  undefined8 uStack_3420;
  undefined8 local_3418;
  undefined8 uStack_3410;
  undefined8 local_3408;
  undefined8 uStack_3400;
  long local_33f8;
  ulong uStack_33f0;
  long *local_33e0;
  ulong local_33d8;
  ulong uStack_33d0;
  undefined8 local_33c8;
  undefined8 uStack_33c0;
  undefined8 local_33b8;
  undefined8 uStack_33b0;
  undefined8 local_33a8;
  undefined8 uStack_33a0;
  ulong local_3398;
  ulong uStack_3390;
  ulong *local_3380;
  undefined8 local_3378;
  undefined8 uStack_3370;
  undefined8 local_3368;
  undefined8 uStack_3360;
  undefined8 local_3358;
  undefined8 uStack_3350;
  undefined8 local_3348;
  undefined8 uStack_3340;
  long local_3338;
  ulong uStack_3330;
  long *local_3320;
  undefined8 local_3318;
  undefined8 uStack_3310;
  undefined8 local_3308;
  undefined8 uStack_3300;
  undefined8 local_32f8;
  undefined8 uStack_32f0;
  undefined8 local_32e8;
  undefined8 uStack_32e0;
  undefined8 local_32d8;
  undefined8 uStack_32d0;
  undefined8 *local_32c8;
  ulong *local_32c0;
  ulong *local_32b8;
  ulong *local_32b0;
  float local_32a8;
  undefined4 uStack_32a4;
  float fStack_32a0;
  undefined4 uStack_329c;
  ulong *local_3298;
  ulong *local_3290;
  ulong *local_3288;
  long *local_3280;
  undefined4 local_3278;
  float fStack_3274;
  float fStack_3270;
  undefined4 uStack_326c;
  long *local_3268;
  ulong *local_3260;
  ulong *local_3258;
  ulong *local_3250;
  float local_3248;
  undefined4 uStack_3244;
  float fStack_3240;
  undefined4 uStack_323c;
  ulong *local_3238;
  ulong *local_3230;
  ulong *local_3228;
  long *local_3220;
  undefined4 local_3218;
  float fStack_3214;
  float fStack_3210;
  undefined4 uStack_320c;
  long *local_3208;
  undefined8 *local_3200;
  undefined1 *local_31f8;
  undefined8 *local_31f0;
  float local_31e8;
  float fStack_31e4;
  float fStack_31e0;
  float fStack_31dc;
  undefined8 *local_31d8;
  undefined8 *local_31d0;
  undefined1 *local_31c8;
  undefined8 *local_31c0;
  float local_31b8;
  float fStack_31b4;
  float fStack_31b0;
  float fStack_31ac;
  undefined8 *local_31a8;
  undefined8 *local_31a0;
  undefined8 *local_3198;
  undefined8 *local_3190;
  float local_3188;
  float fStack_3184;
  float fStack_3180;
  float fStack_317c;
  undefined8 *local_3178;
  undefined8 *local_3170;
  undefined8 *local_3168;
  undefined8 *local_3160;
  float local_3158;
  float fStack_3154;
  float fStack_3150;
  float fStack_314c;
  undefined8 *local_3148;
  undefined8 *local_3110;
  undefined8 *local_3108;
  undefined8 *local_3100;
  float local_30f8;
  float fStack_30f4;
  float fStack_30f0;
  float fStack_30ec;
  undefined8 *local_30e0;
  undefined8 local_30d8;
  undefined8 uStack_30d0;
  undefined8 *local_30c0;
  long local_30b8;
  ulong uStack_30b0;
  long *local_30a0;
  ulong local_3098;
  ulong uStack_3090;
  ulong *local_3080;
  long local_3078;
  ulong uStack_3070;
  long *local_3060;
  ulong local_3058;
  ulong uStack_3050;
  ulong *local_3040;
  undefined8 *local_3038;
  undefined8 *local_3030;
  long *local_3028;
  undefined8 *local_3020;
  ulong *local_3018;
  undefined8 *local_3010;
  long *local_3008;
  undefined8 *local_3000;
  ulong *local_2ff8;
  undefined8 *local_2ff0;
  undefined8 *local_2fe8;
  undefined8 *local_2fe0;
  long *local_2fd8;
  undefined8 *local_2fd0;
  ulong *local_2fc8;
  undefined8 *local_2fc0;
  long *local_2fb8;
  undefined8 *local_2fb0;
  ulong *local_2fa8;
  undefined8 *local_2fa0;
  undefined8 local_2f98;
  undefined8 uStack_2f90;
  undefined8 local_2f88;
  undefined8 uStack_2f80;
  undefined8 local_2f78;
  undefined8 uStack_2f70;
  undefined8 local_2f68;
  undefined8 uStack_2f60;
  undefined8 local_2f58;
  undefined8 uStack_2f50;
  ulong local_2f38;
  undefined8 uStack_2f30;
  undefined8 *local_2f20;
  undefined8 *local_2f18;
  undefined8 *local_2f10;
  float local_2f08;
  float fStack_2f04;
  float fStack_2f00;
  float fStack_2efc;
  undefined8 *local_2ef8;
  undefined8 *local_2ef0;
  undefined8 *local_2ee8;
  undefined8 *local_2ee0;
  float local_2ed8;
  float fStack_2ed4;
  float fStack_2ed0;
  float fStack_2ecc;
  undefined8 *local_2ec8;
  undefined8 *local_2ec0;
  undefined8 *local_2eb8;
  undefined8 *local_2eb0;
  float local_2ea8;
  float fStack_2ea4;
  float fStack_2ea0;
  float fStack_2e9c;
  undefined8 *local_2e98;
  undefined8 *local_2e90;
  long *local_2e88;
  undefined8 *local_2e80;
  float local_2e78;
  float fStack_2e74;
  float fStack_2e70;
  float fStack_2e6c;
  undefined8 *local_2e68;
  undefined8 *local_2e60;
  ulong *local_2e58;
  undefined8 *local_2e50;
  float local_2e48;
  float fStack_2e44;
  float fStack_2e40;
  float fStack_2e3c;
  undefined8 *local_2e38;
  undefined8 *local_2e30;
  ulong *local_2e28;
  ulong *local_2e20;
  float local_2e18;
  undefined4 uStack_2e14;
  float fStack_2e10;
  undefined4 uStack_2e0c;
  ulong *local_2e08;
  undefined8 *local_2e00;
  undefined8 *local_2df8;
  undefined8 *local_2df0;
  float local_2de8;
  float fStack_2de4;
  float fStack_2de0;
  float fStack_2ddc;
  undefined8 *local_2dd8;
  undefined8 *local_2dd0;
  long *local_2dc8;
  undefined8 *local_2dc0;
  float local_2db8;
  float fStack_2db4;
  float fStack_2db0;
  float fStack_2dac;
  undefined8 *local_2da8;
  undefined8 *local_2da0;
  ulong *local_2d98;
  undefined8 *local_2d90;
  float local_2d88;
  float fStack_2d84;
  float fStack_2d80;
  float fStack_2d7c;
  undefined8 *local_2d78;
  undefined8 *local_2d70;
  ulong *local_2d68;
  ulong *local_2d60;
  float local_2d58;
  undefined4 uStack_2d54;
  float fStack_2d50;
  undefined4 uStack_2d4c;
  ulong *local_2d48;
  undefined8 *local_2d40;
  undefined8 *local_2d38;
  undefined8 *local_2d30;
  undefined8 *local_2d28;
  undefined8 *local_2d20;
  ulong *local_2d18;
  undefined8 *local_2d10;
  undefined8 local_2d08;
  undefined8 uStack_2d00;
  undefined8 *local_2cf0;
  long *local_2ce8;
  undefined8 *local_2ce0;
  undefined8 local_2cd8;
  undefined8 uStack_2cd0;
  undefined8 *local_2cc0;
  ulong *local_2cb8;
  undefined8 *local_2cb0;
  undefined8 local_2ca8;
  undefined8 uStack_2ca0;
  undefined8 *local_2c90;
  long *local_2c88;
  undefined8 *local_2c80;
  undefined8 local_2c78;
  undefined8 uStack_2c70;
  undefined8 *local_2c60;
  undefined8 *local_2c58;
  undefined8 *local_2c50;
  undefined8 local_2c48;
  undefined8 uStack_2c40;
  undefined8 *local_2c30;
  float local_2c28;
  float fStack_2c24;
  float fStack_2c20;
  float fStack_2c1c;
  float local_2c18;
  float fStack_2c14;
  float fStack_2c10;
  float fStack_2c0c;
  undefined4 local_2c08;
  undefined4 uStack_2c04;
  undefined4 uStack_2c00;
  undefined4 uStack_2bfc;
  float local_2bf8;
  float fStack_2bf4;
  float fStack_2bf0;
  float fStack_2bec;
  undefined4 local_2be8;
  undefined4 uStack_2be4;
  undefined4 uStack_2be0;
  undefined4 uStack_2bdc;
  undefined8 local_2bd8;
  undefined8 uStack_2bd0;
  long local_2bc8;
  ulong uStack_2bc0;
  ulong local_2bb8;
  ulong uStack_2bb0;
  long local_2ba8;
  ulong uStack_2ba0;
  ulong local_2b98;
  ulong uStack_2b90;
  undefined8 *local_2b80;
  long *local_2b78;
  ulong *local_2b70;
  long *local_2b68;
  ulong *local_2b60;
  undefined8 *local_2b58;
  ulong *local_2b50;
  undefined8 *local_2b48;
  ulong *local_2b40;
  undefined8 *local_2b38;
  long *local_2b30;
  undefined8 *local_2b28;
  undefined8 *local_2b20;
  undefined8 *local_2b18;
  ulong *local_2b10;
  undefined8 *local_2b08;
  ulong *local_2b00;
  undefined8 *local_2af8;
  long *local_2af0;
  undefined8 *local_2ae8;
  undefined8 *local_2ae0;
  undefined8 *local_2ad8;
  undefined8 *local_2ad0;
  undefined8 *local_2ac8;
  undefined8 *local_2ac0;
  ulong *local_2ab8;
  undefined8 *local_2ab0;
  undefined8 local_2aa8;
  undefined8 uStack_2aa0;
  undefined8 *local_2a90;
  float local_2a88;
  float fStack_2a84;
  float fStack_2a80;
  float fStack_2a7c;
  ulong local_2a78;
  ulong uStack_2a70;
  ulong *local_2a60;
  long *local_2a58;
  undefined8 *local_2a50;
  undefined8 local_2a48;
  undefined8 uStack_2a40;
  undefined8 *local_2a30;
  float local_2a28;
  float fStack_2a24;
  float fStack_2a20;
  float fStack_2a1c;
  long local_2a18;
  ulong uStack_2a10;
  long *local_2a00;
  ulong *local_29f8;
  undefined8 *local_29f0;
  undefined8 local_29e8;
  undefined8 uStack_29e0;
  undefined8 *local_29d0;
  float local_29c8;
  float fStack_29c4;
  float fStack_29c0;
  float fStack_29bc;
  ulong local_29b8;
  ulong uStack_29b0;
  ulong *local_29a0;
  long *local_2998;
  undefined8 *local_2990;
  undefined8 local_2988;
  undefined8 uStack_2980;
  undefined8 *local_2970;
  float local_2968;
  float fStack_2964;
  float fStack_2960;
  float fStack_295c;
  long local_2958;
  ulong uStack_2950;
  long *local_2940;
  undefined8 *local_2938;
  undefined8 *local_2930;
  undefined8 local_2928;
  undefined8 uStack_2920;
  undefined8 *local_2910;
  float local_2908;
  float fStack_2904;
  float fStack_2900;
  float fStack_28fc;
  undefined8 local_28f8;
  undefined8 uStack_28f0;
  undefined8 *local_28e0;
  undefined8 local_28d8;
  undefined8 uStack_28d0;
  ulong local_28c8;
  ulong uStack_28c0;
  undefined8 local_28b8;
  undefined8 uStack_28b0;
  ulong local_28a8;
  ulong uStack_28a0;
  undefined8 local_2898;
  undefined8 uStack_2890;
  long local_2888;
  ulong uStack_2880;
  undefined8 local_2878;
  undefined8 uStack_2870;
  undefined8 local_2868;
  undefined8 uStack_2860;
  undefined8 local_2858;
  undefined8 uStack_2850;
  ulong local_2848;
  ulong uStack_2840;
  undefined8 local_2838;
  undefined8 uStack_2830;
  ulong local_2828;
  ulong uStack_2820;
  undefined8 local_2818;
  undefined8 uStack_2810;
  long local_2808;
  ulong uStack_2800;
  undefined8 local_27f8;
  undefined8 uStack_27f0;
  undefined8 local_27e8;
  undefined8 uStack_27e0;
  undefined8 local_27d8;
  undefined8 uStack_27d0;
  undefined8 local_27c8;
  undefined8 uStack_27c0;
  undefined8 local_27b8;
  undefined8 uStack_27b0;
  undefined8 local_27a8;
  undefined8 uStack_27a0;
  undefined8 local_2798;
  undefined8 uStack_2790;
  undefined8 local_2788;
  undefined8 uStack_2780;
  float local_2768;
  float fStack_2764;
  float fStack_2760;
  float fStack_275c;
  undefined8 local_2758;
  undefined8 uStack_2750;
  undefined8 local_2748;
  undefined8 uStack_2740;
  undefined8 local_2738;
  undefined8 uStack_2730;
  undefined8 local_2728;
  undefined8 uStack_2720;
  float local_2718;
  float fStack_2714;
  float fStack_2710;
  float fStack_270c;
  float local_26f8;
  float fStack_26f4;
  float fStack_26f0;
  float fStack_26ec;
  ulong local_26d8;
  ulong uStack_26d0;
  ulong local_26c8;
  ulong uStack_26c0;
  ulong local_26b8;
  ulong uStack_26b0;
  ulong local_26a8;
  ulong uStack_26a0;
  ulong local_2698;
  ulong uStack_2690;
  ulong local_2688;
  ulong uStack_2680;
  ulong local_2678;
  ulong uStack_2670;
  ulong local_2668;
  ulong uStack_2660;
  undefined1 local_2618 [16];
  undefined4 local_25fc;
  undefined1 local_25f8 [16];
  undefined4 local_25dc;
  undefined1 local_25d8 [16];
  float local_25bc;
  ulong local_25b8;
  undefined8 uStack_25b0;
  ulong local_25a8;
  undefined8 uStack_25a0;
  ulong local_2598;
  undefined8 uStack_2590;
  float local_2558;
  undefined8 local_2548;
  undefined8 uStack_2540;
  ulong local_2538;
  undefined8 uStack_2530;
  undefined8 local_2528;
  undefined8 uStack_2520;
  undefined8 local_2518;
  undefined8 uStack_2510;
  undefined8 local_2508;
  undefined8 uStack_2500;
  ulong local_24f8;
  undefined8 uStack_24f0;
  undefined8 local_24e8;
  undefined8 uStack_24e0;
  ulong local_24d8;
  undefined8 uStack_24d0;
  undefined8 local_24c8;
  undefined8 uStack_24c0;
  ulong local_24b8;
  undefined8 uStack_24b0;
  float local_24a4;
  undefined4 local_24a0;
  float local_249c;
  ulong *local_2498;
  float local_248c;
  float local_2488;
  undefined4 local_2484;
  ulong *local_2480;
  float local_2474;
  undefined4 local_2470;
  float local_246c;
  ulong *local_2468;
  float local_245c;
  float local_2458;
  undefined4 local_2454;
  ulong *local_2450;
  ulong local_2448;
  ulong uStack_2440;
  undefined4 local_2438;
  float local_2434;
  float local_2430;
  undefined4 local_242c;
  ulong local_2428;
  ulong uStack_2420;
  float local_2418;
  undefined4 local_2414;
  float local_2410;
  undefined4 local_240c;
  ulong local_2408;
  ulong uStack_2400;
  undefined4 local_23f8;
  float local_23f4;
  float local_23f0;
  undefined4 local_23ec;
  ulong local_23e8;
  ulong uStack_23e0;
  float local_23d8;
  undefined4 local_23d4;
  float local_23d0;
  undefined4 local_23cc;
  float local_2378;
  float fStack_2374;
  float fStack_2370;
  float fStack_236c;
  float local_2368;
  float local_2358;
  float fStack_2354;
  float fStack_2350;
  float fStack_234c;
  float local_233c;
  undefined8 *local_2278;
  undefined8 *local_2270;
  undefined8 local_2268;
  undefined8 uStack_2260;
  undefined8 *local_2258;
  undefined8 *local_2250;
  ulong local_2248;
  undefined8 uStack_2240;
  undefined1 local_2238 [16];
  ulong local_2228;
  undefined8 uStack_2220;
  float local_220c;
  undefined8 local_2208;
  undefined8 uStack_2200;
  float local_21ec;
  undefined8 *local_21e8;
  undefined8 *local_21e0;
  float local_21d4;
  undefined8 *local_21d0;
  undefined8 local_21c8;
  undefined8 uStack_21c0;
  undefined8 local_21b8;
  undefined8 uStack_21b0;
  undefined8 local_21a8;
  undefined8 uStack_21a0;
  undefined8 local_2198;
  undefined8 uStack_2190;
  undefined8 local_2188;
  undefined8 uStack_2180;
  undefined8 *local_2178;
  undefined8 *local_2170;
  undefined8 *local_2168;
  undefined8 *local_2160;
  float local_2158;
  float fStack_2154;
  float fStack_2150;
  float fStack_214c;
  undefined8 *local_2148;
  undefined8 *local_2140;
  undefined8 *local_2138;
  undefined8 *local_2130;
  float local_2128;
  float fStack_2124;
  float fStack_2120;
  float fStack_211c;
  undefined8 *local_2110;
  undefined8 local_2108;
  undefined8 uStack_2100;
  undefined8 *local_20f0;
  undefined8 *local_20e8;
  undefined8 *local_20e0;
  undefined8 *local_20d8;
  undefined8 *local_20d0;
  undefined8 local_20c8;
  undefined8 uStack_20c0;
  ulong local_20b8;
  undefined8 uStack_20b0;
  undefined8 *local_20a0;
  undefined8 *local_2098;
  undefined8 *local_2090;
  float local_2088;
  float fStack_2084;
  float fStack_2080;
  float fStack_207c;
  undefined8 *local_2078;
  undefined8 *local_2070;
  undefined8 *local_2068;
  undefined8 *local_2060;
  float local_2058;
  float fStack_2054;
  float fStack_2050;
  float fStack_204c;
  undefined8 *local_2048;
  undefined8 *local_2040;
  undefined8 *local_2038;
  undefined8 *local_2030;
  undefined8 local_2028;
  undefined8 uStack_2020;
  undefined8 *local_2010;
  float local_2008;
  float fStack_2004;
  float fStack_2000;
  float fStack_1ffc;
  undefined8 local_1ff8;
  undefined8 uStack_1ff0;
  undefined8 *local_1fe0;
  undefined8 *local_1fd8;
  undefined8 *local_1fd0;
  undefined8 *local_1fc8;
  undefined8 *local_1fc0;
  undefined8 *local_1fb8;
  undefined8 *local_1fb0;
  undefined8 local_1fa8;
  undefined8 uStack_1fa0;
  undefined8 *local_1f90;
  float local_1f88;
  float fStack_1f84;
  float fStack_1f80;
  float fStack_1f7c;
  undefined8 local_1f78;
  undefined8 uStack_1f70;
  undefined8 *local_1f60;
  undefined8 local_1f58;
  undefined8 uStack_1f50;
  undefined8 local_1f48;
  undefined8 uStack_1f40;
  undefined8 local_1f38;
  undefined8 uStack_1f30;
  undefined8 local_1f28;
  undefined8 uStack_1f20;
  undefined8 local_1f18;
  undefined8 uStack_1f10;
  undefined8 local_1f08;
  undefined8 uStack_1f00;
  undefined8 local_1ef8;
  undefined8 uStack_1ef0;
  undefined8 local_1ee8;
  undefined8 uStack_1ee0;
  undefined1 local_1ed8 [16];
  undefined4 local_1ebc;
  undefined1 local_1eb8 [16];
  undefined4 local_1e9c;
  undefined1 local_1e98 [16];
  float local_1e7c;
  ulong local_1e78;
  undefined8 uStack_1e70;
  ulong local_1e68;
  undefined8 uStack_1e60;
  ulong local_1e58;
  undefined8 uStack_1e50;
  undefined8 local_1e48;
  undefined8 uStack_1e40;
  ulong local_1e38;
  undefined8 uStack_1e30;
  undefined8 local_1e28;
  undefined8 uStack_1e20;
  undefined8 local_1e18;
  undefined8 uStack_1e10;
  undefined8 local_1e08;
  undefined8 uStack_1e00;
  ulong local_1df8;
  undefined8 uStack_1df0;
  undefined8 local_1de8;
  undefined8 uStack_1de0;
  ulong local_1dd8;
  undefined8 uStack_1dd0;
  undefined8 local_1dc8;
  undefined8 uStack_1dc0;
  ulong local_1db8;
  undefined8 uStack_1db0;
  float local_1da8;
  float fStack_1da4;
  float fStack_1da0;
  float fStack_1d9c;
  float local_1d8c;
  ulong *local_1d88;
  undefined8 *local_1d80;
  undefined8 local_1d78;
  ulong uStack_1d70;
  ulong *local_1d68;
  ulong *local_1d60;
  ulong local_1d58;
  undefined8 uStack_1d50;
  undefined1 local_1d48 [16];
  ulong local_1d38;
  undefined8 uStack_1d30;
  float local_1d1c;
  undefined8 local_1d18;
  undefined8 uStack_1d10;
  float local_1cfc;
  ulong *local_1cf8;
  undefined8 *local_1cf0;
  float local_1ce4;
  undefined8 *local_1ce0;
  undefined8 local_1cd8;
  undefined8 uStack_1cd0;
  undefined8 local_1cc8;
  undefined8 uStack_1cc0;
  undefined8 local_1cb8;
  undefined8 uStack_1cb0;
  undefined8 local_1ca8;
  undefined8 uStack_1ca0;
  undefined8 local_1c98;
  ulong uStack_1c90;
  undefined8 *local_1c88;
  undefined8 *local_1c80;
  ulong *local_1c78;
  undefined8 *local_1c70;
  float local_1c68;
  float fStack_1c64;
  float fStack_1c60;
  float fStack_1c5c;
  undefined8 *local_1c58;
  ulong *local_1c50;
  ulong *local_1c48;
  undefined8 *local_1c40;
  float local_1c38;
  float fStack_1c34;
  float fStack_1c30;
  undefined4 uStack_1c2c;
  undefined8 *local_1c20;
  undefined8 local_1c18;
  ulong uStack_1c10;
  undefined8 *local_1c00;
  undefined8 *local_1bf8;
  undefined8 *local_1bf0;
  undefined8 *local_1be8;
  undefined8 *local_1be0;
  undefined8 local_1bd8;
  undefined8 uStack_1bd0;
  ulong local_1bc8;
  undefined8 uStack_1bc0;
  undefined8 *local_1bb0;
  undefined8 *local_1ba8;
  undefined8 *local_1ba0;
  float local_1b98;
  float fStack_1b94;
  float fStack_1b90;
  float fStack_1b8c;
  undefined8 *local_1b88;
  undefined8 *local_1b80;
  undefined8 *local_1b78;
  undefined8 *local_1b70;
  float local_1b68;
  float fStack_1b64;
  float fStack_1b60;
  float fStack_1b5c;
  undefined8 *local_1b58;
  undefined8 *local_1b50;
  undefined8 *local_1b48;
  undefined8 *local_1b40;
  undefined8 local_1b38;
  undefined8 uStack_1b30;
  undefined8 *local_1b20;
  float local_1b18;
  float fStack_1b14;
  float fStack_1b10;
  float fStack_1b0c;
  undefined8 local_1b08;
  ulong uStack_1b00;
  undefined8 *local_1af0;
  undefined8 *local_1ae8;
  undefined8 *local_1ae0;
  undefined8 *local_1ad8;
  undefined8 *local_1ad0;
  undefined8 *local_1ac8;
  undefined8 *local_1ac0;
  undefined8 local_1ab8;
  undefined8 uStack_1ab0;
  undefined8 *local_1aa0;
  float local_1a98;
  float fStack_1a94;
  float fStack_1a90;
  float fStack_1a8c;
  undefined8 local_1a88;
  ulong uStack_1a80;
  undefined8 *local_1a70;
  undefined8 local_1a68;
  undefined8 uStack_1a60;
  undefined8 local_1a58;
  ulong uStack_1a50;
  undefined8 local_1a48;
  undefined8 uStack_1a40;
  undefined8 local_1a38;
  undefined8 uStack_1a30;
  ulong local_1a28;
  ulong uStack_1a20;
  undefined8 local_1a18;
  ulong uStack_1a10;
  undefined8 local_1a08;
  undefined8 uStack_1a00;
  ulong local_19f8;
  ulong uStack_19f0;
  undefined1 local_19e8 [16];
  undefined4 local_19cc;
  undefined1 local_19c8 [16];
  undefined4 local_19ac;
  undefined1 local_19a8 [16];
  float local_198c;
  ulong local_1988;
  undefined8 uStack_1980;
  ulong local_1978;
  undefined8 uStack_1970;
  ulong local_1968;
  undefined8 uStack_1960;
  undefined8 local_1958;
  undefined8 uStack_1950;
  ulong local_1948;
  undefined8 uStack_1940;
  undefined8 local_1938;
  undefined8 uStack_1930;
  undefined8 local_1928;
  undefined8 uStack_1920;
  undefined8 local_1918;
  undefined8 uStack_1910;
  ulong local_1908;
  undefined8 uStack_1900;
  undefined8 local_18f8;
  undefined8 uStack_18f0;
  ulong local_18e8;
  undefined8 uStack_18e0;
  undefined8 local_18d8;
  undefined8 uStack_18d0;
  ulong local_18c8;
  undefined8 uStack_18c0;
  float local_18b8;
  float fStack_18b4;
  float fStack_18b0;
  float fStack_18ac;
  float local_189c;
  undefined8 *local_1898;
  undefined8 *local_1890;
  undefined8 local_1888;
  undefined8 uStack_1880;
  undefined8 *local_1878;
  undefined8 *local_1870;
  ulong local_1868;
  undefined8 uStack_1860;
  undefined1 local_1858 [16];
  ulong local_1848;
  undefined8 uStack_1840;
  float local_182c;
  undefined8 local_1828;
  undefined8 uStack_1820;
  float local_180c;
  undefined8 *local_1808;
  undefined8 *local_1800;
  float local_17f4;
  undefined8 *local_17f0;
  undefined8 local_17e8;
  undefined8 uStack_17e0;
  undefined8 local_17d8;
  undefined8 uStack_17d0;
  undefined8 local_17c8;
  undefined8 uStack_17c0;
  undefined8 local_17b8;
  undefined8 uStack_17b0;
  undefined8 local_17a8;
  undefined8 uStack_17a0;
  undefined8 *local_1798;
  undefined8 *local_1790;
  undefined8 *local_1788;
  undefined8 *local_1780;
  float local_1778;
  float fStack_1774;
  float fStack_1770;
  float fStack_176c;
  undefined8 *local_1768;
  undefined8 *local_1760;
  undefined8 *local_1758;
  undefined8 *local_1750;
  float local_1748;
  float fStack_1744;
  float fStack_1740;
  float fStack_173c;
  undefined8 *local_1730;
  undefined8 local_1728;
  undefined8 uStack_1720;
  undefined8 *local_1710;
  undefined8 *local_1708;
  undefined8 *local_1700;
  undefined8 *local_16f8;
  undefined8 *local_16f0;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  ulong local_16d8;
  undefined8 uStack_16d0;
  undefined8 *local_16c0;
  undefined8 *local_16b8;
  undefined8 *local_16b0;
  float local_16a8;
  float fStack_16a4;
  float fStack_16a0;
  float fStack_169c;
  undefined8 *local_1698;
  undefined8 *local_1690;
  undefined8 *local_1688;
  undefined8 *local_1680;
  float local_1678;
  float fStack_1674;
  float fStack_1670;
  float fStack_166c;
  undefined8 *local_1668;
  undefined8 *local_1660;
  undefined8 *local_1658;
  undefined8 *local_1650;
  undefined8 local_1648;
  undefined8 uStack_1640;
  undefined8 *local_1630;
  float local_1628;
  float fStack_1624;
  float fStack_1620;
  float fStack_161c;
  undefined8 local_1618;
  undefined8 uStack_1610;
  undefined8 *local_1600;
  undefined8 *local_15f8;
  undefined8 *local_15f0;
  undefined8 *local_15e8;
  undefined8 *local_15e0;
  undefined8 *local_15d8;
  undefined8 *local_15d0;
  undefined8 local_15c8;
  undefined8 uStack_15c0;
  undefined8 *local_15b0;
  float local_15a8;
  float fStack_15a4;
  float fStack_15a0;
  float fStack_159c;
  undefined8 local_1598;
  undefined8 uStack_1590;
  undefined8 *local_1580;
  undefined8 local_1578;
  undefined8 uStack_1570;
  undefined8 local_1568;
  undefined8 uStack_1560;
  undefined8 local_1558;
  undefined8 uStack_1550;
  undefined8 local_1548;
  undefined8 uStack_1540;
  undefined8 local_1538;
  undefined8 uStack_1530;
  undefined8 local_1528;
  undefined8 uStack_1520;
  undefined8 local_1518;
  undefined8 uStack_1510;
  undefined8 local_1508;
  undefined8 uStack_1500;
  undefined1 local_14f8 [16];
  undefined4 local_14dc;
  undefined1 local_14d8 [16];
  undefined4 local_14bc;
  undefined1 local_14b8 [16];
  float local_149c;
  ulong local_1498;
  undefined8 uStack_1490;
  ulong local_1488;
  undefined8 uStack_1480;
  ulong local_1478;
  undefined8 uStack_1470;
  undefined8 local_1468;
  undefined8 uStack_1460;
  ulong local_1458;
  undefined8 uStack_1450;
  undefined8 local_1448;
  undefined8 uStack_1440;
  undefined8 local_1438;
  undefined8 uStack_1430;
  undefined8 local_1428;
  undefined8 uStack_1420;
  ulong local_1418;
  undefined8 uStack_1410;
  undefined8 local_1408;
  undefined8 uStack_1400;
  ulong local_13f8;
  undefined8 uStack_13f0;
  undefined8 local_13e8;
  undefined8 uStack_13e0;
  ulong local_13d8;
  undefined8 uStack_13d0;
  float local_13c8;
  float fStack_13c4;
  float fStack_13c0;
  float fStack_13bc;
  float local_13ac;
  ulong *local_13a8;
  undefined8 *local_13a0;
  undefined8 local_1398;
  ulong uStack_1390;
  ulong *local_1388;
  ulong *local_1380;
  ulong local_1378;
  undefined8 uStack_1370;
  undefined1 local_1368 [16];
  ulong local_1358;
  undefined8 uStack_1350;
  float local_133c;
  undefined8 local_1338;
  undefined8 uStack_1330;
  float local_131c;
  ulong *local_1318;
  undefined8 *local_1310;
  float local_1304;
  undefined8 *local_1300;
  undefined8 local_12f8;
  undefined8 uStack_12f0;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined8 local_12d8;
  undefined8 uStack_12d0;
  undefined8 local_12c8;
  undefined8 uStack_12c0;
  undefined8 local_12b8;
  ulong uStack_12b0;
  undefined8 *local_12a8;
  undefined8 *local_12a0;
  ulong *local_1298;
  undefined8 *local_1290;
  float local_1288;
  float fStack_1284;
  float fStack_1280;
  float fStack_127c;
  undefined8 *local_1278;
  ulong *local_1270;
  ulong *local_1268;
  undefined8 *local_1260;
  float local_1258;
  float fStack_1254;
  float fStack_1250;
  undefined4 uStack_124c;
  undefined8 *local_1240;
  undefined8 local_1238;
  ulong uStack_1230;
  undefined8 *local_1220;
  undefined8 *local_1218;
  undefined8 *local_1210;
  undefined8 *local_1208;
  undefined8 *local_1200;
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  ulong local_11e8;
  undefined8 uStack_11e0;
  undefined8 *local_11d0;
  undefined8 *local_11c8;
  undefined8 *local_11c0;
  float local_11b8;
  float fStack_11b4;
  float fStack_11b0;
  float fStack_11ac;
  undefined8 *local_11a8;
  undefined8 *local_11a0;
  undefined8 *local_1198;
  undefined8 *local_1190;
  float local_1188;
  float fStack_1184;
  float fStack_1180;
  float fStack_117c;
  undefined8 *local_1178;
  undefined8 *local_1170;
  undefined8 *local_1168;
  undefined8 *local_1160;
  undefined8 local_1158;
  undefined8 uStack_1150;
  undefined8 *local_1140;
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  undefined8 local_1128;
  ulong uStack_1120;
  undefined8 *local_1110;
  undefined8 *local_1108;
  undefined8 *local_1100;
  undefined8 *local_10f8;
  undefined8 *local_10f0;
  undefined8 *local_10e8;
  undefined8 *local_10e0;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined8 *local_10c0;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  undefined8 local_10a8;
  ulong uStack_10a0;
  undefined8 *local_1090;
  undefined8 local_1088;
  undefined8 uStack_1080;
  undefined8 local_1078;
  ulong uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  ulong local_1048;
  ulong uStack_1040;
  undefined8 local_1038;
  ulong uStack_1030;
  undefined8 local_1028;
  undefined8 uStack_1020;
  ulong local_1018;
  ulong uStack_1010;
  undefined1 local_1008 [16];
  undefined4 local_fec;
  undefined1 local_fe8 [16];
  undefined4 local_fcc;
  undefined1 local_fc8 [16];
  float local_fac;
  ulong local_fa8;
  undefined8 uStack_fa0;
  ulong local_f98;
  undefined8 uStack_f90;
  ulong local_f88;
  undefined8 uStack_f80;
  undefined8 local_f78;
  undefined8 uStack_f70;
  ulong local_f68;
  undefined8 uStack_f60;
  undefined8 local_f58;
  undefined8 uStack_f50;
  undefined8 local_f48;
  undefined8 uStack_f40;
  undefined8 local_f38;
  undefined8 uStack_f30;
  ulong local_f28;
  undefined8 uStack_f20;
  undefined8 local_f18;
  undefined8 uStack_f10;
  ulong local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  ulong local_ee8;
  undefined8 uStack_ee0;
  float local_ed8;
  float fStack_ed4;
  float fStack_ed0;
  float fStack_ecc;
  float local_ebc;
  ulong local_eb8;
  ulong uStack_eb0;
  ulong *local_ea8;
  ulong *local_ea0;
  undefined1 local_e91;
  ulong *local_e90;
  ulong local_e88;
  ulong uStack_e80;
  ulong *local_e70;
  undefined4 local_e68;
  undefined4 uStack_e64;
  undefined4 uStack_e60;
  undefined4 uStack_e5c;
  ulong local_e58;
  ulong uStack_e50;
  ulong *local_e48;
  ulong *local_e40;
  undefined1 local_e31;
  ulong *local_e30;
  ulong local_e28;
  ulong uStack_e20;
  ulong *local_e10;
  undefined4 local_e08;
  undefined4 uStack_e04;
  undefined4 uStack_e00;
  undefined4 uStack_dfc;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  undefined1 local_dc8 [16];
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined1 local_d98 [16];
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 *local_d60;
  Vec3fa *local_d58;
  undefined8 *local_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 *local_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 *local_d10;
  undefined1 *local_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 *local_cd0;
  undefined1 *local_cb8;
  undefined8 *local_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined1 local_c78 [16];
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined1 local_c48 [16];
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 *local_c10;
  undefined1 (*local_c08) [16];
  undefined8 *local_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 *local_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 *local_bc0;
  undefined1 *local_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 *local_b80;
  undefined1 *local_b68;
  undefined8 *local_b60;
  Vec3fa *local_b58;
  undefined8 *local_b50;
  undefined8 *local_b48;
  undefined8 *local_b40;
  undefined1 (*local_b38) [16];
  undefined8 *local_b30;
  undefined8 *local_b28;
  undefined8 *local_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  ulong local_a78;
  ulong uStack_a70;
  ulong local_a68;
  ulong uStack_a60;
  ulong local_a58;
  ulong uStack_a50;
  ulong local_a48;
  ulong uStack_a40;
  ulong local_a38;
  ulong uStack_a30;
  ulong local_a28;
  ulong uStack_a20;
  ulong local_a18;
  ulong uStack_a10;
  ulong local_a08;
  ulong uStack_a00;
  ulong local_9f8;
  ulong uStack_9f0;
  ulong local_9e8;
  ulong uStack_9e0;
  ulong local_9d8;
  ulong uStack_9d0;
  ulong local_9c8;
  ulong uStack_9c0;
  ulong local_9b8;
  ulong uStack_9b0;
  ulong local_9a8;
  ulong uStack_9a0;
  ulong local_998;
  ulong uStack_990;
  ulong local_988;
  ulong uStack_980;
  ulong local_978;
  ulong uStack_970;
  ulong local_968;
  ulong uStack_960;
  undefined8 *local_958;
  undefined8 *local_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 *local_930;
  undefined1 local_928 [16];
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 *local_900;
  undefined8 *local_8f8;
  undefined8 *local_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 *local_8d0;
  undefined1 local_8c8 [16];
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 *local_8a0;
  undefined1 *local_898;
  undefined8 *local_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 *local_870;
  undefined1 local_868 [16];
  undefined1 *local_840;
  undefined8 *local_838;
  undefined8 *local_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 *local_810;
  undefined1 local_808 [16];
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 *local_7e0;
  undefined8 *local_7d8;
  undefined8 *local_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 *local_7b0;
  undefined1 local_7a8 [16];
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 *local_780;
  undefined1 *local_778;
  undefined8 *local_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 *local_750;
  undefined1 local_748 [16];
  undefined1 *local_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 *local_708;
  undefined8 *local_700;
  undefined8 *local_6f8;
  undefined8 *local_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 *local_6d0;
  undefined8 *local_6c8;
  undefined8 *local_6c0;
  undefined8 *local_6b8;
  undefined8 *local_6b0;
  undefined8 *local_6a8;
  undefined8 *local_6a0;
  float local_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  undefined8 *local_680;
  undefined8 *local_678;
  undefined8 *local_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 *local_640;
  undefined8 *local_638;
  undefined8 *local_630;
  float local_628;
  float fStack_624;
  float fStack_620;
  float fStack_61c;
  undefined8 *local_610;
  undefined8 *local_608;
  undefined8 *local_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined1 *local_5d0;
  undefined8 *local_5c8;
  undefined8 *local_5c0;
  float local_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  undefined8 *local_5a0;
  undefined1 *local_598;
  undefined8 *local_590;
  float fStack_584;
  float fStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined1 *local_560;
  undefined8 *local_558;
  undefined8 *local_550;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  undefined8 *local_530;
  undefined1 *local_528;
  undefined8 *local_520;
  float fStack_514;
  float fStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 *local_4f0;
  undefined8 *local_4e8;
  undefined8 *local_4e0;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  undefined8 *local_4a8;
  undefined8 *local_4a0;
  undefined8 *local_498;
  undefined8 *local_490;
  undefined8 *local_488;
  undefined8 *local_480;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  undefined8 local_468;
  undefined8 uStack_460;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  undefined8 *local_440;
  undefined8 *local_438;
  undefined8 *local_430;
  undefined1 (*local_428) [16];
  undefined8 *local_420;
  undefined8 *local_418;
  undefined1 *local_410;
  undefined8 *local_408;
  undefined8 *local_400;
  Vec3fa *local_3f8;
  undefined8 *local_3f0;
  undefined8 *local_3e8;
  undefined1 *local_3e0;
  undefined8 *local_3d8;
  undefined8 *local_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 *local_3b0;
  undefined8 *local_3a8;
  undefined1 *local_3a0;
  undefined8 *local_398;
  undefined8 *local_390;
  undefined1 *local_388;
  undefined8 *local_380;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  undefined8 *local_360;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  undefined8 *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  undefined8 *local_2f0;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  undefined8 *local_2d0;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 *local_290;
  undefined8 *local_288;
  undefined1 *local_280;
  undefined8 *local_278;
  undefined8 *local_270;
  undefined1 *local_268;
  undefined8 *local_260;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  undefined8 *local_240;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  undefined8 *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  undefined8 *local_1d0;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  undefined8 *local_1b0;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  undefined8 *local_180;
  undefined8 *local_178;
  undefined8 *local_170;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined8 *local_150;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 *local_120;
  undefined8 *local_118;
  undefined8 *local_110;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined8 *local_f0;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 *local_c0;
  undefined8 *local_b8;
  undefined8 *local_b0;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined8 *local_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 *local_60;
  undefined8 *local_58;
  undefined8 *local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined8 *local_30;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_3978 = in_RSI;
  local_3970 = in_RCX;
  local_3968 = in_RDX;
  Light_SampleRes::Light_SampleRes(in_RDI);
  local_3948 = (undefined8 *)(local_3978 + 0x10);
  local_3950 = (undefined8 *)(local_3968 + 0x20);
  local_3940 = &local_3988;
  uVar1 = *local_3948;
  uVar2 = *(undefined8 *)(local_3978 + 0x18);
  uVar3 = *local_3950;
  uVar4 = *(undefined8 *)(local_3968 + 0x28);
  local_34c8._0_4_ = (float)uVar1;
  local_34c8._4_4_ = (float)((ulong)uVar1 >> 0x20);
  uStack_34c0._0_4_ = (float)uVar2;
  uStack_34c0._4_4_ = (float)((ulong)uVar2 >> 0x20);
  local_34d8._0_4_ = (float)uVar3;
  local_34d8._4_4_ = (float)((ulong)uVar3 >> 0x20);
  uStack_34d0._0_4_ = (float)uVar4;
  uStack_34d0._4_4_ = (float)((ulong)uVar4 >> 0x20);
  local_34b8 = (float)local_34c8 - (float)local_34d8;
  fStack_34b4 = local_34c8._4_4_ - local_34d8._4_4_;
  fStack_34b0 = (float)uStack_34c0 - (float)uStack_34d0;
  fStack_34ac = uStack_34c0._4_4_ - uStack_34d0._4_4_;
  local_2798 = CONCAT44(fStack_34b4,local_34b8);
  uStack_2790 = CONCAT44(fStack_34ac,fStack_34b0);
  local_32c8 = &local_3938;
  local_30f8 = local_34b8 * local_34b8;
  fStack_30f4 = fStack_34b4 * fStack_34b4;
  fStack_30f0 = fStack_34b0 * fStack_34b0;
  fStack_30ec = fStack_34ac * fStack_34ac;
  local_30d8 = CONCAT44(fStack_30f4,local_30f8);
  uStack_30d0 = CONCAT44(fStack_30ec,fStack_30f0);
  local_30c0 = &local_32d8;
  local_3030 = &local_32e8;
  local_2c48 = CONCAT44(fStack_30f4,fStack_30f4);
  uStack_2c40 = CONCAT44(fStack_30f4,fStack_30f4);
  local_2fe0 = &local_32f8;
  local_2928 = CONCAT44(fStack_30f0,fStack_30f0);
  uStack_2920 = CONCAT44(fStack_30f0,fStack_30f0);
  local_2f18 = &local_3318;
  local_2ed8 = local_30f8 + fStack_30f4;
  fStack_2ed4 = fStack_30f4 + fStack_30f4;
  fStack_2ed0 = fStack_30f0 + fStack_30f4;
  fStack_2ecc = fStack_30ec + fStack_30f4;
  local_27a8 = CONCAT44(fStack_2ed4,local_2ed8);
  uStack_27a0 = CONCAT44(fStack_2ecc,fStack_2ed0);
  local_2f10 = &local_3308;
  local_398c = local_2ed8 + fStack_30f0;
  fStack_2f04 = fStack_2ed4 + fStack_30f0;
  fStack_2f00 = fStack_2ed0 + fStack_30f0;
  fStack_2efc = fStack_2ecc + fStack_30f0;
  local_2f98 = CONCAT44(fStack_2f04,local_398c);
  uStack_2f90 = CONCAT44(fStack_2efc,fStack_2f00);
  local_25d8 = ZEXT416((uint)local_398c);
  local_38f8 = CONCAT44(0,local_398c);
  uStack_38f0 = 0;
  uStack_25b0 = 0;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_38f8;
  local_3908 = rsqrtss(auVar22,auVar22);
  local_25dc = 0x3fc00000;
  local_25f8 = ZEXT416(0x3fc00000);
  local_24c8 = local_3908._0_8_;
  uVar13 = local_24c8;
  uStack_24c0 = local_3908._8_8_;
  local_24c8._0_4_ = local_3908._0_4_;
  local_24b8 = (ulong)(uint)((float)local_24c8 * 1.5);
  uStack_24b0 = 0;
  local_25fc = 0xbf000000;
  local_2618 = ZEXT416(0xbf000000);
  local_24e8 = local_2618._0_8_;
  uStack_24e0 = 0;
  local_24d8 = (ulong)(uint)(local_398c * -0.5);
  uStack_24d0 = 0;
  local_2508 = local_3908._0_8_;
  uStack_2500 = local_3908._8_8_;
  local_3990 = local_398c * -0.5 * (float)local_24c8;
  local_24f8 = (ulong)(uint)local_3990;
  uStack_24f0 = 0;
  local_2528 = local_3908._0_8_;
  uStack_2520 = local_3908._8_8_;
  local_2518 = CONCAT44(local_3908._4_4_,(float)local_24c8 * (float)local_24c8);
  uStack_2510 = local_3908._8_8_;
  local_2548 = local_2518;
  uStack_2540 = local_3908._8_8_;
  local_3990 = local_3990 * (float)local_24c8 * (float)local_24c8;
  local_2538 = (ulong)(uint)local_3990;
  uStack_2530 = 0;
  local_25a8 = local_2538;
  uStack_25a0 = 0;
  local_3990 = (float)local_24c8 * 1.5 + local_3990;
  local_2598 = (ulong)(uint)local_3990;
  uStack_2590 = 0;
  local_3918 = local_2598;
  uStack_3910 = 0;
  local_2f38 = local_2598;
  uStack_2f30 = 0;
  local_3850 = &local_39a8;
  local_3500 = &local_3878;
  local_2738 = CONCAT44(local_3990,local_3990);
  uStack_2730 = CONCAT44(local_3990,local_3990);
  local_3188 = local_34b8 * local_3990;
  fStack_3184 = fStack_34b4 * local_3990;
  fStack_3180 = fStack_34b0 * local_3990;
  fStack_317c = fStack_34ac * local_3990;
  local_39a8 = CONCAT44(fStack_3184,local_3188);
  uStack_39a0 = CONCAT44(fStack_317c,fStack_3180);
  local_3800 = &in_RDI->dir;
  *(undefined8 *)&local_3800->field_0 = local_39a8;
  *(undefined8 *)((long)&(in_RDI->dir).field_0 + 8) = uStack_39a0;
  in_RDI->dist = local_398c * local_3990;
  local_37f8 = &inf;
  local_3928 = local_3940;
  local_3920 = local_3940;
  local_38dc = local_398c;
  local_385c = local_3990;
  local_3858 = local_3940;
  local_3808 = local_3850;
  local_3504 = local_3990;
  local_34d8 = uVar3;
  uStack_34d0 = uVar4;
  local_34c8 = uVar1;
  uStack_34c0 = uVar2;
  local_34a0 = local_3940;
  local_31a0 = local_3500;
  local_3198 = local_3940;
  local_3190 = local_3850;
  local_3178 = local_3850;
  local_3110 = local_3940;
  local_3108 = local_3940;
  local_3100 = local_32c8;
  local_30e0 = local_32c8;
  local_3038 = local_30c0;
  local_2fe8 = local_30c0;
  local_2f20 = local_2fe0;
  local_2f08 = local_398c;
  local_2ef8 = local_2f10;
  local_2ef0 = local_3030;
  local_2ee8 = local_30c0;
  local_2ee0 = local_2f18;
  local_2ec8 = local_2f18;
  local_2d40 = local_2f10;
  local_2c58 = local_30c0;
  local_2c50 = local_3030;
  local_2c30 = local_3030;
  local_2c28 = fStack_30f4;
  fStack_2c24 = fStack_30f4;
  fStack_2c20 = fStack_30f4;
  fStack_2c1c = fStack_30f4;
  local_2bd8 = local_30d8;
  uStack_2bd0 = uStack_30d0;
  local_2b80 = local_30c0;
  local_2ad8 = local_3030;
  local_2ad0 = local_30c0;
  local_2ac8 = local_2fe0;
  local_2ac0 = local_2f18;
  local_2938 = local_30c0;
  local_2930 = local_2fe0;
  local_2910 = local_2fe0;
  local_2908 = fStack_30f0;
  fStack_2904 = fStack_30f0;
  fStack_2900 = fStack_30f0;
  fStack_28fc = fStack_30f0;
  local_28f8 = local_30d8;
  uStack_28f0 = uStack_30d0;
  local_28e0 = local_30c0;
  local_27d8 = local_2c48;
  uStack_27d0 = uStack_2c40;
  local_27c8 = local_30d8;
  uStack_27c0 = uStack_30d0;
  local_27b8 = local_2928;
  uStack_27b0 = uStack_2920;
  local_2788 = local_2798;
  uStack_2780 = uStack_2790;
  local_2728 = local_2798;
  uStack_2720 = uStack_2790;
  local_25bc = local_398c;
  local_25b8 = local_38f8;
  local_24c8 = uVar13;
  local_2358 = local_3990;
  fStack_2354 = local_3990;
  fStack_2350 = local_3990;
  fStack_234c = local_3990;
  local_233c = local_3990;
  local_3988 = local_2798;
  uStack_3980 = uStack_2790;
  local_3938 = local_30d8;
  uStack_3930 = uStack_30d0;
  local_3878 = local_2738;
  uStack_3870 = uStack_2730;
  local_3318 = local_27a8;
  uStack_3310 = uStack_27a0;
  local_3308 = local_2f98;
  uStack_3300 = uStack_2f90;
  local_32f8 = local_2928;
  uStack_32f0 = uStack_2920;
  local_32e8 = local_2c48;
  uStack_32e0 = uStack_2c40;
  local_32d8 = local_30d8;
  uStack_32d0 = uStack_30d0;
  fVar14 = std::numeric_limits<float>::infinity();
  in_RDI->pdf = fVar14;
  local_3888 = (undefined8 *)(local_3978 + 0x20);
  local_37e4 = local_3990;
  local_388c = local_3990 * local_3990;
  local_3880 = &local_39b8;
  local_34f0 = &local_38a8;
  local_2758 = CONCAT44(local_388c,local_388c);
  uStack_2750 = CONCAT44(local_388c,local_388c);
  local_3160 = &local_39b8;
  local_3170 = &local_38a8;
  uVar1 = *local_3888;
  uVar2 = *(undefined8 *)(local_3978 + 0x28);
  local_2748._0_4_ = (float)uVar1;
  local_2748._4_4_ = (float)((ulong)uVar1 >> 0x20);
  uStack_2740._0_4_ = (float)uVar2;
  uStack_2740._4_4_ = (float)((ulong)uVar2 >> 0x20);
  local_3158 = (float)local_2748 * local_388c;
  fStack_3154 = local_2748._4_4_ * local_388c;
  fStack_3150 = (float)uStack_2740 * local_388c;
  fStack_314c = uStack_2740._4_4_ * local_388c;
  local_3148 = &local_39b8;
  local_39b8 = CONCAT44(fStack_3154,local_3158);
  uStack_39b0 = CONCAT44(fStack_314c,fStack_3150);
  local_3818 = &local_39b8;
  *(undefined8 *)&(in_RDI->weight).field_0 = local_39b8;
  *(undefined8 *)((long)&(in_RDI->weight).field_0 + 8) = uStack_39b0;
  local_39bc = *(float *)(local_3978 + 0x30) * local_3990;
  if (0.0 < *(float *)(local_3978 + 0x30) && 0.005 < local_39bc) {
    local_34f4 = local_388c;
    local_3168 = local_3888;
    local_2748 = uVar1;
    uStack_2740 = uVar2;
    local_2378 = local_388c;
    fStack_2374 = local_388c;
    fStack_2370 = local_388c;
    fStack_236c = local_388c;
    local_2368 = local_388c;
    local_38a8 = local_2758;
    uStack_38a0 = uStack_2750;
    if (1.0 <= local_39bc) {
      local_3590 = &local_3a40;
      local_3598 = local_3970;
      local_3a40 = *local_3970;
      local_3a3c = local_3970[1];
      cosineSampleHemisphere(in_stack_ffffffffffffc550);
      local_3698 = (undefined1 (*) [16])(local_3968 + 0x40);
      local_3690 = &local_3a88;
      local_2458 = *(float *)(local_3968 + 0x48);
      local_245c = -*(float *)(local_3968 + 0x44);
      local_3658 = &local_36a8;
      local_2454 = 0;
      local_242c = 0;
      local_2438 = 0;
      local_26d8 = (ulong)(uint)local_2458 << 0x20;
      uStack_26d0 = (ulong)(uint)local_245c;
      local_246c = -*(float *)(local_3968 + 0x48);
      local_2474 = *(float *)*local_3698;
      local_3678 = &local_36b8;
      local_2470 = 0;
      local_240c = 0;
      local_2414 = 0;
      local_26b8 = (ulong)(uint)local_246c;
      uStack_26b0 = (ulong)(uint)local_2474;
      local_3320 = &local_3668;
      local_3218 = 0;
      fStack_3214 = local_2458 * local_2458;
      fStack_3210 = local_245c * local_245c;
      uStack_320c = 0;
      local_30b8 = (ulong)(uint)fStack_3214 << 0x20;
      uStack_30b0 = (ulong)(uint)fStack_3210;
      local_30a0 = &local_3338;
      local_3020 = &local_3348;
      local_2c78 = CONCAT44(fStack_3214,fStack_3214);
      uStack_2c70 = CONCAT44(fStack_3214,fStack_3214);
      local_2fd0 = &local_3358;
      local_2988 = CONCAT44(fStack_3210,fStack_3210);
      uStack_2980 = CONCAT44(fStack_3210,fStack_3210);
      local_2eb8 = &local_3378;
      local_2e78 = fStack_3214 + 0.0;
      fStack_2e74 = fStack_3214 + fStack_3214;
      fStack_2e70 = fStack_3210 + fStack_3214;
      fStack_2e6c = fStack_3214 + 0.0;
      local_27e8 = CONCAT44(fStack_2e74,local_2e78);
      uStack_27e0 = CONCAT44(fStack_2e6c,fStack_2e70);
      local_2eb0 = &local_3368;
      local_2ea8 = local_2e78 + fStack_3210;
      fStack_2ea4 = fStack_2e74 + fStack_3210;
      fStack_2ea0 = fStack_2e70 + fStack_3210;
      fStack_2e9c = fStack_2e6c + fStack_3210;
      local_2f88 = CONCAT44(fStack_2ea4,local_2ea8);
      uStack_2f80 = CONCAT44(fStack_2e9c,fStack_2ea0);
      local_3380 = &local_3688;
      local_3248 = local_246c * local_246c;
      uStack_3244 = 0;
      fStack_3240 = local_2474 * local_2474;
      uStack_323c = 0;
      local_3098 = (ulong)(uint)local_3248;
      uStack_3090 = (ulong)(uint)fStack_3240;
      local_3080 = &local_3398;
      local_3010 = &local_33a8;
      local_2ca8 = 0;
      uStack_2ca0 = 0;
      local_2fc0 = &local_33b8;
      local_29e8 = CONCAT44(fStack_3240,fStack_3240);
      uStack_29e0 = CONCAT44(fStack_3240,fStack_3240);
      local_2e58 = &local_33d8;
      local_2e18 = local_3248 + 0.0;
      uStack_2e14 = 0;
      fStack_2e10 = fStack_3240 + 0.0;
      uStack_2e0c = 0;
      local_2828 = (ulong)(uint)local_2e18;
      uStack_2820 = (ulong)(uint)fStack_2e10;
      local_2e50 = &local_33c8;
      local_2e48 = local_2e18 + fStack_3240;
      fStack_2e44 = fStack_3240 + 0.0;
      fStack_2e40 = fStack_2e10 + fStack_3240;
      fStack_2e3c = fStack_3240 + 0.0;
      local_2f78 = CONCAT44(fStack_2e44,local_2e48);
      uStack_2f70 = CONCAT44(fStack_2e3c,fStack_2e40);
      local_e31 = local_2e48 < local_2ea8;
      local_e30 = &local_36d8;
      local_e40 = &local_36a8;
      local_e48 = &local_36b8;
      if ((bool)local_e31) {
        local_ac8 = 0;
        uStack_ac0 = 0;
        local_ad8 = 0;
        uStack_ad0 = 0;
        local_b08 = 0;
        uStack_b00 = 0;
        local_b18 = 0;
        uStack_b10 = 0;
        local_e08 = 0xffffffff;
        uStack_e04 = 0xffffffff;
        uStack_e00 = 0xffffffff;
        uStack_dfc = 0xffffffff;
        local_3ad8 = 0xffffffffffffffff;
        uStackY_3ad0 = 0xffffffffffffffff;
      }
      else {
        local_a98 = 0;
        uStack_a90 = 0;
        local_3ad8 = 0;
        uStackY_3ad0 = 0;
      }
      local_e58 = local_3ad8;
      uStack_e50 = uStackY_3ad0;
      local_a78 = local_3ad8;
      uStack_a70 = uStackY_3ad0;
      local_9a8 = local_3ad8;
      uStack_9a0 = uStackY_3ad0;
      local_9e8 = local_3ad8 & local_26d8;
      uStack_9e0 = uStackY_3ad0 & uStack_26d0;
      local_968 = local_3ad8;
      uStack_960 = uStackY_3ad0;
      local_9f8 = ~local_3ad8 & local_26b8;
      uStack_9f0 = ~uStackY_3ad0 & uStack_26b0;
      local_1048 = local_9e8 | local_9f8;
      uStack_1040 = uStack_9e0 | uStack_9f0;
      local_13a8 = &local_36d8;
      local_13a0 = &local_36c8;
      local_12a8 = &local_1398;
      local_1038._0_4_ = (float)local_9f8;
      local_1038._4_4_ = (float)(local_9e8 >> 0x20);
      uStack_1030._0_4_ = (float)uStack_1040;
      local_1258 = (float)local_1038 * (float)local_1038;
      fStack_1254 = local_1038._4_4_ * local_1038._4_4_;
      fStack_1250 = (float)uStack_1030 * (float)uStack_1030;
      uStack_124c = 0;
      local_1238 = CONCAT44(fStack_1254,local_1258);
      uStack_1230 = (ulong)(uint)fStack_1250;
      local_1220 = &local_12b8;
      local_1210 = &local_12c8;
      local_1158 = CONCAT44(fStack_1254,fStack_1254);
      uStack_1150 = CONCAT44(fStack_1254,fStack_1254);
      local_1200 = &local_12d8;
      local_10d8 = CONCAT44(fStack_1250,fStack_1250);
      uStack_10d0 = CONCAT44(fStack_1250,fStack_1250);
      local_11c8 = &local_12f8;
      local_1188 = local_1258 + fStack_1254;
      fStack_1184 = fStack_1254 + fStack_1254;
      fStack_1180 = fStack_1250 + fStack_1254;
      fStack_117c = fStack_1254 + 0.0;
      local_1058 = CONCAT44(fStack_1184,local_1188);
      uStack_1050 = CONCAT44(fStack_117c,fStack_1180);
      local_11c0 = &local_12e8;
      local_133c = local_1188 + fStack_1250;
      fStack_11b4 = fStack_1184 + fStack_1250;
      fStack_11b0 = fStack_1180 + fStack_1250;
      fStack_11ac = fStack_117c + fStack_1250;
      local_11f8 = CONCAT44(fStack_11b4,local_133c);
      uStack_11f0 = CONCAT44(fStack_11ac,fStack_11b0);
      local_fc8 = ZEXT416((uint)local_133c);
      local_1358 = CONCAT44(0,local_133c);
      uStack_1350 = 0;
      uStack_fa0 = 0;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_1358;
      local_1368 = rsqrtss(auVar8,auVar8);
      local_fcc = 0x3fc00000;
      local_fe8 = ZEXT416(0x3fc00000);
      local_ef8 = local_1368._0_8_;
      uVar4 = local_ef8;
      uStack_ef0 = local_1368._8_8_;
      local_ef8._0_4_ = local_1368._0_4_;
      local_ee8 = (ulong)(uint)((float)local_ef8 * 1.5);
      uStack_ee0 = 0;
      local_fec = 0xbf000000;
      local_1008 = ZEXT416(0xbf000000);
      local_f18 = local_1008._0_8_;
      uStack_f10 = 0;
      local_f08 = (ulong)(uint)(local_133c * -0.5);
      uStack_f00 = 0;
      local_f38 = local_1368._0_8_;
      uStack_f30 = local_1368._8_8_;
      local_131c = local_133c * -0.5 * (float)local_ef8;
      local_f28 = (ulong)(uint)local_131c;
      uStack_f20 = 0;
      local_f58 = local_1368._0_8_;
      uStack_f50 = local_1368._8_8_;
      local_f48 = CONCAT44(local_1368._4_4_,(float)local_ef8 * (float)local_ef8);
      uStack_f40 = local_1368._8_8_;
      local_f78 = local_f48;
      uStack_f70 = local_1368._8_8_;
      local_131c = local_131c * (float)local_ef8 * (float)local_ef8;
      local_f68 = (ulong)(uint)local_131c;
      uStack_f60 = 0;
      local_f98 = local_f68;
      uStack_f90 = 0;
      local_131c = (float)local_ef8 * 1.5 + local_131c;
      local_f88 = (ulong)(uint)local_131c;
      uStack_f80 = 0;
      local_1378 = local_f88;
      uStack_1370 = 0;
      local_11e8 = local_f88;
      uStack_11e0 = 0;
      local_1300 = &local_1338;
      local_1028 = CONCAT44(local_131c,local_131c);
      uStack_1020 = CONCAT44(local_131c,local_131c);
      local_1288 = (float)local_1038 * local_131c;
      fStack_1284 = local_1038._4_4_ * local_131c;
      fStack_1280 = (float)uStack_1030 * local_131c;
      fStack_127c = local_131c * 0.0;
      local_1898 = &local_36f8;
      local_bd8 = *(undefined8 *)*local_3698;
      uStack_bd0 = *(undefined8 *)(local_3968 + 0x48);
      local_bc0 = &local_c28;
      auVar11._8_8_ = uStack_36c0;
      auVar11._0_8_ = local_36c8;
      local_ba0 = local_c48;
      local_890 = &local_c38;
      fStack_620 = (float)local_36c8;
      auVar19._12_4_ = (float)((ulong)uStack_36c0 >> 0x20);
      auVar19._0_8_ = auVar11._4_8_;
      auVar19._8_4_ = fStack_620;
      local_868._8_8_ = auVar19._8_8_;
      uStack_880 = local_868._8_8_;
      uStack_c30 = local_868._8_8_;
      local_b98 = *(undefined8 *)*local_3698;
      uStack_b90 = *(undefined8 *)(local_3968 + 0x48);
      auVar22 = *local_3698;
      local_b80 = &local_c68;
      local_8f0 = &local_c58;
      auVar20._12_4_ = (float)((ulong)uStack_b90 >> 0x20);
      auVar20._0_8_ = auVar22._4_8_;
      auVar20._8_4_ = (float)local_b98;
      local_8c8._8_8_ = auVar20._8_8_;
      uStack_8e0 = local_8c8._8_8_;
      uStack_c50 = local_8c8._8_8_;
      local_b68 = local_c78;
      local_708 = &local_ca8;
      uStack_570 = local_8c8._8_8_;
      local_578._0_4_ = auVar22._4_4_;
      local_578._4_4_ = auVar22._8_4_;
      fStack_584 = (float)((ulong)local_36c8 >> 0x20);
      fStack_580 = (float)uStack_36c0;
      local_5b8 = (float)local_578 * fStack_620;
      fStack_5b4 = local_578._4_4_ * fStack_584;
      fStack_5b0 = (float)local_b98 * fStack_580;
      fStack_5ac = auVar20._12_4_ * auVar19._12_4_;
      local_958 = &local_c98;
      local_630 = &local_718;
      uStack_5f0 = local_868._8_8_;
      local_5e8._0_4_ = (float)local_bd8;
      local_5e8._4_4_ = (float)((ulong)local_bd8 >> 0x20);
      uStack_5e0._0_4_ = (float)uStack_bd0;
      uStack_5e0._4_4_ = (float)((ulong)uStack_bd0 >> 0x20);
      local_628 = (float)local_5e8 * fStack_584;
      fStack_624 = local_5e8._4_4_ * fStack_580;
      fStack_620 = (float)uStack_5e0 * fStack_620;
      fStack_61c = uStack_5e0._4_4_ * auVar19._12_4_;
      local_468 = CONCAT44(fStack_624,local_628);
      uStack_460 = CONCAT44(fStack_61c,fStack_620);
      local_478 = (float)local_ca8;
      fStack_474 = (float)((ulong)local_ca8 >> 0x20);
      fStack_470 = (float)uStack_ca0;
      fStack_46c = (float)((ulong)uStack_ca0 >> 0x20);
      local_458 = local_628 - local_478;
      fStack_454 = fStack_624 - fStack_474;
      fStack_450 = fStack_620 - fStack_470;
      auVar21._12_4_ = fStack_61c - fStack_46c;
      local_918 = CONCAT44(fStack_454,local_458);
      uStack_910 = CONCAT44(auVar21._12_4_,fStack_450);
      local_b60 = &local_c88;
      auVar10._8_8_ = uStack_910;
      auVar10._0_8_ = local_918;
      auVar21._0_8_ = auVar10._4_8_;
      auVar21._8_4_ = local_458;
      local_928._8_8_ = auVar21._8_8_;
      uStack_940 = local_928._8_8_;
      uStack_c80 = local_928._8_8_;
      uStack_bf0 = local_928._8_8_;
      uStack_36f0 = local_928._8_8_;
      local_1890 = &local_36e8;
      local_1798 = &local_1888;
      uStack_1520 = local_928._8_8_;
      uStack_1530 = local_928._8_8_;
      local_1748 = fStack_454 * fStack_454;
      fStack_1744 = fStack_450 * fStack_450;
      fStack_1740 = local_458 * local_458;
      fStack_173c = auVar21._12_4_ * auVar21._12_4_;
      local_1728 = CONCAT44(fStack_1744,local_1748);
      uStack_1720 = CONCAT44(fStack_173c,fStack_1740);
      local_1710 = &local_17a8;
      local_1700 = &local_17b8;
      local_1648 = CONCAT44(fStack_1744,fStack_1744);
      uStack_1640 = CONCAT44(fStack_1744,fStack_1744);
      local_16f0 = &local_17c8;
      local_15c8 = CONCAT44(fStack_1740,fStack_1740);
      uStack_15c0 = CONCAT44(fStack_1740,fStack_1740);
      local_16b8 = &local_17e8;
      local_1678 = local_1748 + fStack_1744;
      fStack_1674 = fStack_1744 + fStack_1744;
      fStack_1670 = fStack_1740 + fStack_1744;
      fStack_166c = fStack_173c + fStack_1744;
      local_1548 = CONCAT44(fStack_1674,local_1678);
      uStack_1540 = CONCAT44(fStack_166c,fStack_1670);
      local_16b0 = &local_17d8;
      local_182c = local_1678 + fStack_1740;
      fStack_16a4 = fStack_1674 + fStack_1740;
      fStack_16a0 = fStack_1670 + fStack_1740;
      fStack_169c = fStack_166c + fStack_1740;
      local_16e8 = CONCAT44(fStack_16a4,local_182c);
      uStack_16e0 = CONCAT44(fStack_169c,fStack_16a0);
      local_14b8 = ZEXT416((uint)local_182c);
      local_1848 = CONCAT44(0,local_182c);
      uStack_1840 = 0;
      uStack_1490 = 0;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_1848;
      local_1858 = rsqrtss(auVar7,auVar7);
      local_14bc = 0x3fc00000;
      local_14d8 = ZEXT416(0x3fc00000);
      local_13e8 = local_1858._0_8_;
      uVar3 = local_13e8;
      uStack_13e0 = local_1858._8_8_;
      local_13e8._0_4_ = local_1858._0_4_;
      local_13d8 = (ulong)(uint)((float)local_13e8 * 1.5);
      uStack_13d0 = 0;
      local_14dc = 0xbf000000;
      local_14f8 = ZEXT416(0xbf000000);
      local_1408 = local_14f8._0_8_;
      uStack_1400 = 0;
      local_13f8 = (ulong)(uint)(local_182c * -0.5);
      uStack_13f0 = 0;
      local_1428 = local_1858._0_8_;
      uStack_1420 = local_1858._8_8_;
      local_180c = local_182c * -0.5 * (float)local_13e8;
      local_1418 = (ulong)(uint)local_180c;
      uStack_1410 = 0;
      local_1448 = local_1858._0_8_;
      uStack_1440 = local_1858._8_8_;
      local_1438 = CONCAT44(local_1858._4_4_,(float)local_13e8 * (float)local_13e8);
      uStack_1430 = local_1858._8_8_;
      local_1468 = local_1438;
      uStack_1460 = local_1858._8_8_;
      local_180c = local_180c * (float)local_13e8 * (float)local_13e8;
      local_1458 = (ulong)(uint)local_180c;
      uStack_1450 = 0;
      local_1488 = local_1458;
      uStack_1480 = 0;
      local_180c = (float)local_13e8 * 1.5 + local_180c;
      local_1478 = (ulong)(uint)local_180c;
      uStack_1470 = 0;
      local_1868 = local_1478;
      uStack_1860 = 0;
      local_16d8 = local_1478;
      uStack_16d0 = 0;
      local_17f0 = &local_1828;
      local_1518 = CONCAT44(local_180c,local_180c);
      uStack_1510 = CONCAT44(local_180c,local_180c);
      uStack_1500 = local_928._8_8_;
      local_1778 = fStack_454 * local_180c;
      fStack_1774 = fStack_450 * local_180c;
      fStack_1770 = local_458 * local_180c;
      fStack_176c = auVar21._12_4_ * local_180c;
      local_36e8 = CONCAT44(fStack_1774,local_1778);
      uStack_36e0 = CONCAT44(fStack_176c,fStack_1770);
      local_3778 = &local_3a88;
      local_410 = local_3a78;
      local_420 = &local_3a68;
      uVar1 = *(undefined8 *)*local_3698;
      uVar2 = *(undefined8 *)(local_3968 + 0x48);
      local_3838 = &local_3a58;
      local_3780 = &local_3a38;
      local_3510 = local_3798;
      local_3520 = local_37b8;
      local_1f8 = local_3a78;
      local_3530 = local_37d8;
      local_31d0 = &local_3a68;
      local_31c0 = &local_37c8;
      local_2718 = (float)local_3a68;
      fStack_2714 = (float)((ulong)local_3a68 >> 0x20);
      fStack_2710 = (float)uStack_3a60;
      fStack_270c = (float)((ulong)uStack_3a60 >> 0x20);
      local_31b8 = local_3a38.m128[2] * local_2718;
      fStack_31b4 = local_3a38.m128[2] * fStack_2714;
      fStack_31b0 = local_3a38.m128[2] * fStack_2710;
      fStack_31ac = local_3a38.m128[2] * fStack_270c;
      local_290 = &local_37a8;
      local_1d0 = &local_218;
      local_1a8 = (float)local_3a78._0_8_;
      fStack_1a4 = SUB84(local_3a78._0_8_,4);
      fStack_1a0 = (float)local_3a78._8_8_;
      fStack_19c = SUB84(local_3a78._8_8_,4);
      local_1c8 = local_3a38.m128[1] * local_1a8;
      fStack_1c4 = local_3a38.m128[1] * fStack_1a4;
      fStack_1c0 = local_3a38.m128[1] * fStack_1a0;
      fStack_1bc = local_3a38.m128[1] * fStack_19c;
      local_138 = CONCAT44(fStack_1c4,local_1c8);
      uStack_130 = CONCAT44(fStack_1bc,fStack_1c0);
      local_148 = (float)local_37c8;
      fStack_144 = (float)((ulong)local_37c8 >> 0x20);
      fStack_140 = (float)uStack_37c0;
      fStack_13c = (float)((ulong)uStack_37c0 >> 0x20);
      local_168 = local_1c8 + local_148;
      fStack_164 = fStack_1c4 + fStack_144;
      fStack_160 = fStack_1c0 + fStack_140;
      fStack_15c = fStack_1bc + fStack_13c;
      local_260 = &local_2a8;
      local_238 = (float)local_3a88;
      fStack_234 = (float)((ulong)local_3a88 >> 0x20);
      fStack_230 = (float)uStack_3a80;
      fStack_22c = (float)((ulong)uStack_3a80 >> 0x20);
      local_258 = local_3a38.m128[0] * local_238;
      fStack_254 = local_3a38.m128[0] * fStack_234;
      fStack_250 = local_3a38.m128[0] * fStack_230;
      fStack_24c = local_3a38.m128[0] * fStack_22c;
      local_d8 = CONCAT44(fStack_254,local_258);
      uStack_d0 = CONCAT44(fStack_24c,fStack_250);
      local_e8 = (float)local_37a8;
      fStack_e4 = (float)((ulong)local_37a8 >> 0x20);
      fStack_e0 = (float)uStack_37a0;
      fStack_dc = (float)((ulong)uStack_37a0 >> 0x20);
      local_108 = local_258 + local_e8;
      fStack_104 = fStack_254 + fStack_e4;
      fStack_100 = fStack_250 + fStack_e0;
      fStack_fc = fStack_24c + fStack_dc;
      local_3a58 = CONCAT44(fStack_104,local_108);
      uStack_3a50 = CONCAT44(fStack_fc,fStack_100);
      local_3830 = &in_RDI->dir;
      *(undefined8 *)&local_3830->field_0 = local_3a58;
      *(undefined8 *)((long)&(in_RDI->dir).field_0 + 8) = uStack_3a50;
      local_3770 = local_3838;
      local_3670 = local_3678;
      local_3650 = local_3658;
      local_3260 = local_3678;
      local_3258 = local_3678;
      local_3250 = local_3380;
      local_3238 = local_3380;
      local_3230 = local_3658;
      local_3228 = local_3658;
      local_3220 = local_3320;
      local_3208 = local_3320;
      local_31c8 = local_3530;
      local_31a8 = local_31c0;
      local_3028 = local_30a0;
      local_3018 = local_3080;
      local_2fd8 = local_30a0;
      local_2fc8 = local_3080;
      local_2ec0 = local_2fd0;
      local_2e98 = local_2eb0;
      local_2e90 = local_3020;
      local_2e88 = local_30a0;
      local_2e80 = local_2eb8;
      local_2e68 = local_2eb8;
      local_2e60 = local_2fc0;
      local_2e38 = local_2e50;
      local_2e30 = local_3010;
      local_2e28 = local_3080;
      local_2e20 = local_2e58;
      local_2e08 = local_2e58;
      local_2d38 = local_2eb0;
      local_2d30 = local_2e50;
      local_2cb8 = local_3080;
      local_2cb0 = local_3010;
      local_2c90 = local_3010;
      local_2c88 = local_30a0;
      local_2c80 = local_3020;
      local_2c60 = local_3020;
      local_2c18 = fStack_3214;
      fStack_2c14 = fStack_3214;
      fStack_2c10 = fStack_3214;
      fStack_2c0c = fStack_3214;
      local_2c08 = uStack_3244;
      uStack_2c04 = uStack_3244;
      uStack_2c00 = uStack_3244;
      uStack_2bfc = uStack_3244;
      local_2bc8 = local_30b8;
      uStack_2bc0 = uStack_30b0;
      local_2bb8 = local_3098;
      uStack_2bb0 = uStack_3090;
      local_2b78 = local_30a0;
      local_2b70 = local_3080;
      local_2b18 = local_3010;
      local_2b10 = local_3080;
      local_2b08 = local_2fc0;
      local_2b00 = local_2e58;
      local_2af8 = local_3020;
      local_2af0 = local_30a0;
      local_2ae8 = local_2fd0;
      local_2ae0 = local_2eb8;
      local_29f8 = local_3080;
      local_29f0 = local_2fc0;
      local_29d0 = local_2fc0;
      local_29c8 = fStack_3240;
      fStack_29c4 = fStack_3240;
      fStack_29c0 = fStack_3240;
      fStack_29bc = fStack_3240;
      local_29b8 = local_3098;
      uStack_29b0 = uStack_3090;
      local_29a0 = local_3080;
      local_2998 = local_30a0;
      local_2990 = local_2fd0;
      local_2970 = local_2fd0;
      local_2968 = fStack_3210;
      fStack_2964 = fStack_3210;
      fStack_2960 = fStack_3210;
      fStack_295c = fStack_3210;
      local_2958 = local_30b8;
      uStack_2950 = uStack_30b0;
      local_2940 = local_30a0;
      local_2858 = local_2ca8;
      uStack_2850 = uStack_2ca0;
      local_2848 = local_3098;
      uStack_2840 = uStack_3090;
      local_2838 = local_29e8;
      uStack_2830 = uStack_29e0;
      local_2818 = local_2c78;
      uStack_2810 = uStack_2c70;
      local_2808 = local_30b8;
      uStack_2800 = uStack_30b0;
      local_27f8 = local_2988;
      uStack_27f0 = uStack_2980;
      local_26c8 = local_26d8;
      uStack_26c0 = uStack_26d0;
      local_26a8 = local_26b8;
      uStack_26a0 = uStack_26b0;
      local_2468 = local_3678;
      local_2450 = local_3658;
      local_2448 = local_26d8;
      uStack_2440 = uStack_26d0;
      local_2434 = local_2458;
      local_2430 = local_245c;
      local_2428 = local_26b8;
      uStack_2420 = uStack_26b0;
      local_2418 = local_246c;
      local_2410 = local_2474;
      local_1878 = local_1898;
      local_1870 = local_1898;
      local_1808 = local_1898;
      local_1800 = local_1890;
      local_17f4 = local_180c;
      local_1790 = local_17f0;
      local_1788 = local_1898;
      local_1780 = local_1890;
      local_1768 = local_1890;
      local_1760 = local_1898;
      local_1758 = local_1898;
      local_1750 = local_1798;
      local_1730 = local_1798;
      local_1708 = local_1710;
      local_16f8 = local_1710;
      local_16c0 = local_16f0;
      local_16a8 = local_182c;
      local_1698 = local_16b0;
      local_1690 = local_1700;
      local_1688 = local_1710;
      local_1680 = local_16b8;
      local_1668 = local_16b8;
      local_1660 = local_16b0;
      local_1658 = local_1710;
      local_1650 = local_1700;
      local_1630 = local_1700;
      local_1628 = fStack_1744;
      fStack_1624 = fStack_1744;
      fStack_1620 = fStack_1744;
      fStack_161c = fStack_1744;
      local_1618 = local_1728;
      uStack_1610 = uStack_1720;
      local_1600 = local_1710;
      local_15f8 = local_1700;
      local_15f0 = local_1710;
      local_15e8 = local_16f0;
      local_15e0 = local_16b8;
      local_15d8 = local_1710;
      local_15d0 = local_16f0;
      local_15b0 = local_16f0;
      local_15a8 = fStack_1740;
      fStack_15a4 = fStack_1740;
      fStack_15a0 = fStack_1740;
      fStack_159c = fStack_1740;
      local_1598 = local_1728;
      uStack_1590 = uStack_1720;
      local_1580 = local_1710;
      local_1578 = local_1648;
      uStack_1570 = uStack_1640;
      local_1568 = local_1728;
      uStack_1560 = uStack_1720;
      local_1558 = local_15c8;
      uStack_1550 = uStack_15c0;
      local_1538 = auVar21._0_8_;
      local_1528 = auVar21._0_8_;
      local_1508 = auVar21._0_8_;
      local_149c = local_182c;
      local_1498 = local_1848;
      local_13e8 = uVar3;
      local_13c8 = local_180c;
      fStack_13c4 = local_180c;
      fStack_13c0 = local_180c;
      fStack_13bc = local_180c;
      local_13ac = local_180c;
      local_1388 = local_13a8;
      local_1380 = local_13a8;
      local_1318 = local_13a8;
      local_1310 = local_13a0;
      local_1304 = local_131c;
      local_12a0 = local_1300;
      local_1298 = local_13a8;
      local_1290 = local_13a0;
      local_1278 = local_13a0;
      local_1270 = local_13a8;
      local_1268 = local_13a8;
      local_1260 = local_12a8;
      local_1240 = local_12a8;
      local_1218 = local_1220;
      local_1208 = local_1220;
      local_11d0 = local_1200;
      local_11b8 = local_133c;
      local_11a8 = local_11c0;
      local_11a0 = local_1210;
      local_1198 = local_1220;
      local_1190 = local_11c8;
      local_1178 = local_11c8;
      local_1170 = local_11c0;
      local_1168 = local_1220;
      local_1160 = local_1210;
      local_1140 = local_1210;
      local_1138 = fStack_1254;
      fStack_1134 = fStack_1254;
      fStack_1130 = fStack_1254;
      fStack_112c = fStack_1254;
      local_1128 = local_1238;
      uStack_1120 = uStack_1230;
      local_1110 = local_1220;
      local_1108 = local_1210;
      local_1100 = local_1220;
      local_10f8 = local_1200;
      local_10f0 = local_11c8;
      local_10e8 = local_1220;
      local_10e0 = local_1200;
      local_10c0 = local_1200;
      local_10b8 = fStack_1250;
      fStack_10b4 = fStack_1250;
      fStack_10b0 = fStack_1250;
      fStack_10ac = fStack_1250;
      local_10a8 = local_1238;
      uStack_10a0 = uStack_1230;
      local_1090 = local_1220;
      local_1088 = local_1158;
      uStack_1080 = uStack_1150;
      local_1078 = local_1238;
      uStack_1070 = uStack_1230;
      local_1068 = local_10d8;
      uStack_1060 = uStack_10d0;
      local_1038 = local_1048;
      uStack_1030 = uStack_1040;
      local_1018 = local_1048;
      uStack_1010 = uStack_1040;
      local_fac = local_133c;
      local_fa8 = local_1358;
      local_ef8 = uVar4;
      local_ed8 = local_131c;
      fStack_ed4 = local_131c;
      fStack_ed0 = local_131c;
      fStack_ecc = local_131c;
      local_ebc = local_131c;
      local_e28 = local_1048;
      uStack_e20 = uStack_1040;
      local_e10 = local_13a8;
      local_c10 = local_13a0;
      local_c08 = local_3698;
      local_c00 = local_1898;
      local_bf8 = auVar21._0_8_;
      local_be0 = local_1898;
      local_b38 = local_3698;
      local_b30 = local_1890;
      local_b28 = local_13a0;
      local_b20 = local_3778;
      local_a68 = local_26d8;
      uStack_a60 = uStack_26d0;
      local_a58 = local_26b8;
      uStack_a50 = uStack_26b0;
      local_9b8 = local_26d8;
      uStack_9b0 = uStack_26d0;
      local_978 = local_26b8;
      uStack_970 = uStack_26b0;
      local_950 = local_b60;
      local_948 = auVar21._0_8_;
      local_930 = local_b60;
      local_928 = auVar21;
      local_900 = local_958;
      local_8f8 = local_b80;
      local_8e8 = auVar20._0_8_;
      local_8d0 = local_8f0;
      local_8c8 = auVar20;
      local_8b8 = local_b98;
      uStack_8b0 = uStack_b90;
      local_8a0 = local_b80;
      local_898 = local_ba0;
      local_888 = auVar19._0_8_;
      local_870 = local_890;
      local_868 = auVar19;
      local_840 = local_ba0;
      local_700 = local_890;
      local_6f8 = local_bc0;
      local_6f0 = local_958;
      local_640 = local_890;
      local_638 = local_bc0;
      local_610 = local_630;
      local_608 = local_890;
      local_600 = local_bc0;
      local_5f8 = auVar19._0_8_;
      local_5e8 = local_bd8;
      uStack_5e0 = uStack_bd0;
      local_5d0 = local_b68;
      local_5c8 = local_8f0;
      local_5c0 = local_708;
      local_5a0 = local_708;
      local_598 = local_b68;
      local_590 = local_8f0;
      local_578 = auVar20._0_8_;
      local_490 = local_708;
      local_488 = local_630;
      local_480 = local_958;
      fStack_44c = auVar21._12_4_;
      local_440 = local_958;
      local_438 = local_708;
      local_430 = local_630;
      local_428 = local_3698;
      local_418 = local_1890;
      local_408 = local_13a0;
      local_400 = local_3778;
      local_288 = local_3778;
      local_280 = local_3510;
      local_278 = local_3838;
      local_270 = local_3778;
      local_268 = local_3510;
      local_240 = local_260;
      local_200 = local_31c0;
      local_1f0 = local_3520;
      local_1e8 = local_290;
      local_1e0 = local_1f8;
      local_1d8 = local_3520;
      local_1b0 = local_1d0;
      local_180 = local_31c0;
      local_178 = local_1d0;
      local_170 = local_290;
      local_150 = local_290;
      local_120 = local_290;
      local_118 = local_260;
      local_110 = local_3838;
      local_f0 = local_3838;
      local_3a88 = CONCAT44(fStack_1284,local_1288);
      uStack_3a80 = CONCAT44(fStack_127c,fStack_1280);
      local_3a68 = uVar1;
      uStack_3a60 = uVar2;
      local_37c8 = CONCAT44(fStack_31b4,local_31b8);
      uStack_37c0 = CONCAT44(fStack_31ac,fStack_31b0);
      local_37a8 = CONCAT44(fStack_164,local_168);
      uStack_37a0 = CONCAT44(fStack_15c,fStack_160);
      local_36f8 = auVar21._0_8_;
      local_36d8 = local_1048;
      uStack_36d0 = uStack_1040;
      local_36c8 = CONCAT44(fStack_1284,local_1288);
      uStack_36c0 = CONCAT44(fStack_127c,fStack_1280);
      local_36b8 = local_26b8;
      uStack_36b0 = uStack_26b0;
      local_36a8 = local_26d8;
      uStack_36a0 = uStack_26d0;
      local_3688 = local_3098;
      uStack_3680 = uStack_3090;
      local_3668 = local_30b8;
      uStack_3660 = uStack_30b0;
      local_33d8 = local_2828;
      uStack_33d0 = uStack_2820;
      local_33c8 = local_2f78;
      uStack_33c0 = uStack_2f70;
      local_33b8 = local_29e8;
      uStack_33b0 = uStack_29e0;
      local_33a8 = local_2ca8;
      uStack_33a0 = uStack_2ca0;
      local_3398 = local_3098;
      uStack_3390 = uStack_3090;
      local_3378 = local_27e8;
      uStack_3370 = uStack_27e0;
      local_3368 = local_2f88;
      uStack_3360 = uStack_2f80;
      local_3358 = local_2988;
      uStack_3350 = uStack_2980;
      local_3348 = local_2c78;
      uStack_3340 = uStack_2c70;
      local_3338 = local_30b8;
      uStack_3330 = uStack_30b0;
      local_1888 = local_1728;
      uStack_1880 = uStack_1720;
      local_1828 = local_1518;
      uStack_1820 = uStack_1510;
      local_17e8 = local_1548;
      uStack_17e0 = uStack_1540;
      local_17d8 = local_16e8;
      uStack_17d0 = uStack_16e0;
      local_17c8 = local_15c8;
      uStack_17c0 = uStack_15c0;
      local_17b8 = local_1648;
      uStack_17b0 = uStack_1640;
      local_17a8 = local_1728;
      uStack_17a0 = uStack_1720;
      local_1398 = local_1238;
      uStack_1390 = uStack_1230;
      local_1338 = local_1028;
      uStack_1330 = uStack_1020;
      local_12f8 = local_1058;
      uStack_12f0 = uStack_1050;
      local_12e8 = local_11f8;
      uStack_12e0 = uStack_11f0;
      local_12d8 = local_10d8;
      uStack_12d0 = uStack_10d0;
      local_12c8 = local_1158;
      uStack_12c0 = uStack_1150;
      local_12b8 = local_1238;
      uStack_12b0 = uStack_1230;
      local_ca8 = CONCAT44(fStack_5b4,local_5b8);
      uStack_ca0 = CONCAT44(fStack_5ac,fStack_5b0);
      local_c98 = local_918;
      uStack_c90 = uStack_910;
      local_c88 = auVar21._0_8_;
      local_c68 = local_b98;
      uStack_c60 = uStack_b90;
      local_c58 = auVar20._0_8_;
      local_c38 = auVar19._0_8_;
      local_c28 = local_bd8;
      uStack_c20 = uStack_bd0;
      local_718 = local_468;
      uStack_710 = uStack_460;
      local_2a8 = local_d8;
      uStack_2a0 = uStack_d0;
      local_218 = local_138;
      uStack_210 = uStack_130;
      fVar14 = cosineSampleHemispherePDF((Vec3fa *)&local_3780->field_1);
      in_RDI->pdf = fVar14;
      fVar14 = *(float *)(local_3978 + 0x30) * *(float *)(local_3978 + 0x30);
      auVar22 = rcpss(ZEXT416((uint)fVar14),ZEXT416((uint)fVar14));
      local_2558 = auVar22._0_4_;
      local_2558 = local_2558 * (2.0 - local_2558 * fVar14);
      local_2768 = (float)*(undefined8 *)(local_3978 + 0x20);
      fStack_2764 = (float)((ulong)*(undefined8 *)(local_3978 + 0x20) >> 0x20);
      fStack_2760 = (float)*(undefined8 *)(local_3978 + 0x28);
      fStack_275c = (float)((ulong)*(undefined8 *)(local_3978 + 0x28) >> 0x20);
      *(ulong *)&(in_RDI->weight).field_0 =
           CONCAT44(fStack_2764 * local_2558,local_2768 * local_2558);
      *(ulong *)((long)&(in_RDI->weight).field_0 + 8) =
           CONCAT44(fStack_275c * local_2558,fStack_2760 * local_2558);
      in_RDI->dist = *(float *)(local_3978 + 0x30);
    }
    else {
      local_37dc = 1.0 - local_39bc * local_39bc;
      local_39c0 = sqrtf(local_37dc);
      uniformSampleCone(in_stack_ffffffffffffc544,in_stack_ffffffffffffc538);
      local_35e8 = &in_RDI->dir;
      local_35e0 = &local_3a18;
      local_2488 = (in_RDI->dir).field_0.m128[2];
      local_248c = -(in_RDI->dir).field_0.m128[1];
      local_35a8 = &local_35f8;
      local_2484 = 0;
      local_23ec = 0;
      local_23f8 = 0;
      local_2698 = (ulong)(uint)local_2488 << 0x20;
      uStack_2690 = (ulong)(uint)local_248c;
      local_249c = -(in_RDI->dir).field_0.m128[2];
      local_24a4 = (local_35e8->field_0).m128[0];
      local_35c8 = &local_3608;
      local_24a0 = 0;
      local_23cc = 0;
      local_23d4 = 0;
      local_2678 = (ulong)(uint)local_249c;
      uStack_2670 = (ulong)(uint)local_24a4;
      local_33e0 = &local_35b8;
      local_3278 = 0;
      fStack_3274 = local_2488 * local_2488;
      fStack_3270 = local_248c * local_248c;
      uStack_326c = 0;
      local_3078 = (ulong)(uint)fStack_3274 << 0x20;
      uStack_3070 = (ulong)(uint)fStack_3270;
      local_3060 = &local_33f8;
      local_3000 = &local_3408;
      local_2cd8 = CONCAT44(fStack_3274,fStack_3274);
      uStack_2cd0 = CONCAT44(fStack_3274,fStack_3274);
      local_2fb0 = &local_3418;
      local_2a48 = CONCAT44(fStack_3270,fStack_3270);
      uStack_2a40 = CONCAT44(fStack_3270,fStack_3270);
      local_2df8 = &local_3438;
      local_2db8 = fStack_3274 + 0.0;
      fStack_2db4 = fStack_3274 + fStack_3274;
      fStack_2db0 = fStack_3270 + fStack_3274;
      fStack_2dac = fStack_3274 + 0.0;
      local_2868 = CONCAT44(fStack_2db4,local_2db8);
      uStack_2860 = CONCAT44(fStack_2dac,fStack_2db0);
      local_2df0 = &local_3428;
      local_2de8 = local_2db8 + fStack_3270;
      fStack_2de4 = fStack_2db4 + fStack_3270;
      fStack_2de0 = fStack_2db0 + fStack_3270;
      fStack_2ddc = fStack_2dac + fStack_3270;
      local_2f68 = CONCAT44(fStack_2de4,local_2de8);
      uStack_2f60 = CONCAT44(fStack_2ddc,fStack_2de0);
      local_3440 = &local_35d8;
      local_32a8 = local_249c * local_249c;
      uStack_32a4 = 0;
      fStack_32a0 = local_24a4 * local_24a4;
      uStack_329c = 0;
      local_3058 = (ulong)(uint)local_32a8;
      uStack_3050 = (ulong)(uint)fStack_32a0;
      local_3040 = &local_3458;
      local_2ff0 = &local_3468;
      local_2d08 = 0;
      uStack_2d00 = 0;
      local_2fa0 = &local_3478;
      local_2aa8 = CONCAT44(fStack_32a0,fStack_32a0);
      uStack_2aa0 = CONCAT44(fStack_32a0,fStack_32a0);
      local_2d98 = &local_3498;
      local_2d58 = local_32a8 + 0.0;
      uStack_2d54 = 0;
      fStack_2d50 = fStack_32a0 + 0.0;
      uStack_2d4c = 0;
      local_28a8 = (ulong)(uint)local_2d58;
      uStack_28a0 = (ulong)(uint)fStack_2d50;
      local_2d90 = &local_3488;
      local_2d88 = local_2d58 + fStack_32a0;
      fStack_2d84 = fStack_32a0 + 0.0;
      fStack_2d80 = fStack_2d50 + fStack_32a0;
      fStack_2d7c = fStack_32a0 + 0.0;
      local_2f58 = CONCAT44(fStack_2d84,local_2d88);
      uStack_2f50 = CONCAT44(fStack_2d7c,fStack_2d80);
      local_e91 = local_2d88 < local_2de8;
      local_e90 = &local_3628;
      local_ea0 = &local_35f8;
      local_ea8 = &local_3608;
      if ((bool)local_e91) {
        local_aa8 = 0;
        uStack_aa0 = 0;
        local_ab8 = 0;
        uStack_ab0 = 0;
        local_ae8 = 0;
        uStack_ae0 = 0;
        local_af8 = 0;
        uStack_af0 = 0;
        local_e68 = 0xffffffff;
        uStack_e64 = 0xffffffff;
        uStack_e60 = 0xffffffff;
        uStack_e5c = 0xffffffff;
        local_3ab8 = 0xffffffffffffffff;
        uStack_eb0 = 0xffffffffffffffff;
      }
      else {
        local_a88 = 0;
        uStack_a80 = 0;
        local_3ab8 = 0;
        uStack_eb0 = 0;
      }
      local_eb8 = local_3ab8;
      local_a48 = local_3ab8;
      local_9c8 = local_3ab8;
      local_a08 = local_3ab8 & local_2698;
      uStack_a00 = uStack_eb0 & uStack_2690;
      local_988 = local_3ab8;
      local_a18 = ~local_3ab8 & local_2678;
      uStack_a10 = ~uStack_eb0 & uStack_2670;
      local_1a28 = local_a08 | local_a18;
      uStack_1a20 = uStack_a00 | uStack_a10;
      local_1d88 = &local_3628;
      local_1d80 = &local_3618;
      local_1c88 = &local_1d78;
      local_1a18._0_4_ = (float)local_a18;
      local_1a18._4_4_ = (float)(local_a08 >> 0x20);
      uStack_1a10._0_4_ = (float)uStack_1a20;
      local_1c38 = (float)local_1a18 * (float)local_1a18;
      fStack_1c34 = local_1a18._4_4_ * local_1a18._4_4_;
      fStack_1c30 = (float)uStack_1a10 * (float)uStack_1a10;
      uStack_1c2c = 0;
      local_1c18 = CONCAT44(fStack_1c34,local_1c38);
      uStack_1c10 = (ulong)(uint)fStack_1c30;
      local_1c00 = &local_1c98;
      local_1bf0 = &local_1ca8;
      local_1b38 = CONCAT44(fStack_1c34,fStack_1c34);
      uStack_1b30 = CONCAT44(fStack_1c34,fStack_1c34);
      local_1be0 = &local_1cb8;
      local_1ab8 = CONCAT44(fStack_1c30,fStack_1c30);
      uStack_1ab0 = CONCAT44(fStack_1c30,fStack_1c30);
      local_1ba8 = &local_1cd8;
      local_1b68 = local_1c38 + fStack_1c34;
      fStack_1b64 = fStack_1c34 + fStack_1c34;
      fStack_1b60 = fStack_1c30 + fStack_1c34;
      fStack_1b5c = fStack_1c34 + 0.0;
      local_1a38 = CONCAT44(fStack_1b64,local_1b68);
      uStack_1a30 = CONCAT44(fStack_1b5c,fStack_1b60);
      local_1ba0 = &local_1cc8;
      local_1d1c = local_1b68 + fStack_1c30;
      fStack_1b94 = fStack_1b64 + fStack_1c30;
      fStack_1b90 = fStack_1b60 + fStack_1c30;
      fStack_1b8c = fStack_1b5c + fStack_1c30;
      local_1bd8 = CONCAT44(fStack_1b94,local_1d1c);
      uStack_1bd0 = CONCAT44(fStack_1b8c,fStack_1b90);
      local_19a8 = ZEXT416((uint)local_1d1c);
      local_1d38 = CONCAT44(0,local_1d1c);
      uStack_1d30 = 0;
      uStack_1980 = 0;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_1d38;
      local_1d48 = rsqrtss(auVar6,auVar6);
      local_19ac = 0x3fc00000;
      local_19c8 = ZEXT416(0x3fc00000);
      local_18d8 = local_1d48._0_8_;
      uVar4 = local_18d8;
      uStack_18d0 = local_1d48._8_8_;
      local_18d8._0_4_ = local_1d48._0_4_;
      local_18c8 = (ulong)(uint)((float)local_18d8 * 1.5);
      uStack_18c0 = 0;
      local_19cc = 0xbf000000;
      local_19e8 = ZEXT416(0xbf000000);
      local_18f8 = local_19e8._0_8_;
      uStack_18f0 = 0;
      local_18e8 = (ulong)(uint)(local_1d1c * -0.5);
      uStack_18e0 = 0;
      local_1918 = local_1d48._0_8_;
      uStack_1910 = local_1d48._8_8_;
      local_1cfc = local_1d1c * -0.5 * (float)local_18d8;
      local_1908 = (ulong)(uint)local_1cfc;
      uStack_1900 = 0;
      local_1938 = local_1d48._0_8_;
      uStack_1930 = local_1d48._8_8_;
      local_1928 = CONCAT44(local_1d48._4_4_,(float)local_18d8 * (float)local_18d8);
      uStack_1920 = local_1d48._8_8_;
      local_1958 = local_1928;
      uStack_1950 = local_1d48._8_8_;
      local_1cfc = local_1cfc * (float)local_18d8 * (float)local_18d8;
      local_1948 = (ulong)(uint)local_1cfc;
      uStack_1940 = 0;
      local_1978 = local_1948;
      uStack_1970 = 0;
      local_1cfc = (float)local_18d8 * 1.5 + local_1cfc;
      local_1968 = (ulong)(uint)local_1cfc;
      uStack_1960 = 0;
      local_1d58 = local_1968;
      uStack_1d50 = 0;
      local_1bc8 = local_1968;
      uStack_1bc0 = 0;
      local_1ce0 = &local_1d18;
      local_1a08 = CONCAT44(local_1cfc,local_1cfc);
      uStack_1a00 = CONCAT44(local_1cfc,local_1cfc);
      local_1c68 = (float)local_1a18 * local_1cfc;
      fStack_1c64 = local_1a18._4_4_ * local_1cfc;
      fStack_1c60 = (float)uStack_1a10 * local_1cfc;
      fStack_1c5c = local_1cfc * 0.0;
      local_2278 = &local_3648;
      local_d28 = *(undefined8 *)&local_35e8->field_0;
      uStack_d20 = *(undefined8 *)((long)&(in_RDI->dir).field_0 + 8);
      local_d10 = &local_d78;
      auVar12._8_8_ = uStack_3610;
      auVar12._0_8_ = local_3618;
      local_cf0 = local_d98;
      local_770 = &local_d88;
      fStack_690 = (float)local_3618;
      auVar16._12_4_ = (float)((ulong)uStack_3610 >> 0x20);
      auVar16._0_8_ = auVar12._4_8_;
      auVar16._8_4_ = fStack_690;
      local_748._8_8_ = auVar16._8_8_;
      uStack_760 = local_748._8_8_;
      uStack_d80 = local_748._8_8_;
      local_ce8 = *(undefined8 *)&local_35e8->field_0;
      uStack_ce0 = *(undefined8 *)((long)&(in_RDI->dir).field_0 + 8);
      auVar22 = *(undefined1 (*) [16])(local_35e8->field_0).m128;
      local_cd0 = &local_db8;
      local_7d0 = &local_da8;
      auVar17._12_4_ = (float)((ulong)uStack_ce0 >> 0x20);
      auVar17._0_8_ = auVar22._4_8_;
      auVar17._8_4_ = (float)local_ce8;
      local_7a8._8_8_ = auVar17._8_8_;
      uStack_7c0 = local_7a8._8_8_;
      uStack_da0 = local_7a8._8_8_;
      local_cb8 = local_dc8;
      local_6d0 = &local_df8;
      uStack_500 = local_7a8._8_8_;
      local_508._0_4_ = auVar22._4_4_;
      local_508._4_4_ = auVar22._8_4_;
      fStack_514 = (float)((ulong)local_3618 >> 0x20);
      fStack_510 = (float)uStack_3610;
      local_548 = (float)local_508 * fStack_690;
      fStack_544 = local_508._4_4_ * fStack_514;
      fStack_540 = (float)local_ce8 * fStack_510;
      fStack_53c = auVar17._12_4_ * auVar16._12_4_;
      local_838 = &local_de8;
      local_6a0 = &local_6e8;
      uStack_660 = local_748._8_8_;
      local_658._0_4_ = (float)local_d28;
      local_658._4_4_ = (float)((ulong)local_d28 >> 0x20);
      uStack_650._0_4_ = (float)uStack_d20;
      uStack_650._4_4_ = (float)((ulong)uStack_d20 >> 0x20);
      local_698 = (float)local_658 * fStack_514;
      fStack_694 = local_658._4_4_ * fStack_510;
      fStack_690 = (float)uStack_650 * fStack_690;
      fStack_68c = uStack_650._4_4_ * auVar16._12_4_;
      local_4c8 = CONCAT44(fStack_694,local_698);
      uStack_4c0 = CONCAT44(fStack_68c,fStack_690);
      local_4d8 = (float)local_df8;
      fStack_4d4 = (float)((ulong)local_df8 >> 0x20);
      fStack_4d0 = (float)uStack_df0;
      fStack_4cc = (float)((ulong)uStack_df0 >> 0x20);
      local_4b8 = local_698 - local_4d8;
      fStack_4b4 = fStack_694 - fStack_4d4;
      fStack_4b0 = fStack_690 - fStack_4d0;
      auVar18._12_4_ = fStack_68c - fStack_4cc;
      local_7f8 = CONCAT44(fStack_4b4,local_4b8);
      uStack_7f0 = CONCAT44(auVar18._12_4_,fStack_4b0);
      local_cb0 = &local_dd8;
      auVar9._8_8_ = uStack_7f0;
      auVar9._0_8_ = local_7f8;
      auVar18._0_8_ = auVar9._4_8_;
      auVar18._8_4_ = local_4b8;
      local_808._8_8_ = auVar18._8_8_;
      uStack_820 = local_808._8_8_;
      uStack_dd0 = local_808._8_8_;
      uStack_d40 = local_808._8_8_;
      uStack_3640 = local_808._8_8_;
      local_2270 = &local_3638;
      local_2178 = &local_2268;
      uStack_1f00 = local_808._8_8_;
      uStack_1f10 = local_808._8_8_;
      local_2128 = fStack_4b4 * fStack_4b4;
      fStack_2124 = fStack_4b0 * fStack_4b0;
      fStack_2120 = local_4b8 * local_4b8;
      fStack_211c = auVar18._12_4_ * auVar18._12_4_;
      local_2108 = CONCAT44(fStack_2124,local_2128);
      uStack_2100 = CONCAT44(fStack_211c,fStack_2120);
      local_20f0 = &local_2188;
      local_20e0 = &local_2198;
      local_2028 = CONCAT44(fStack_2124,fStack_2124);
      uStack_2020 = CONCAT44(fStack_2124,fStack_2124);
      local_20d0 = &local_21a8;
      local_1fa8 = CONCAT44(fStack_2120,fStack_2120);
      uStack_1fa0 = CONCAT44(fStack_2120,fStack_2120);
      local_2098 = &local_21c8;
      local_2058 = local_2128 + fStack_2124;
      fStack_2054 = fStack_2124 + fStack_2124;
      fStack_2050 = fStack_2120 + fStack_2124;
      fStack_204c = fStack_211c + fStack_2124;
      local_1f28 = CONCAT44(fStack_2054,local_2058);
      uStack_1f20 = CONCAT44(fStack_204c,fStack_2050);
      local_2090 = &local_21b8;
      local_220c = local_2058 + fStack_2120;
      fStack_2084 = fStack_2054 + fStack_2120;
      fStack_2080 = fStack_2050 + fStack_2120;
      fStack_207c = fStack_204c + fStack_2120;
      local_20c8 = CONCAT44(fStack_2084,local_220c);
      uStack_20c0 = CONCAT44(fStack_207c,fStack_2080);
      local_1e98 = ZEXT416((uint)local_220c);
      local_2228 = CONCAT44(0,local_220c);
      uStack_2220 = 0;
      uStack_1e70 = 0;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_2228;
      local_2238 = rsqrtss(auVar5,auVar5);
      local_1e9c = 0x3fc00000;
      local_1eb8 = ZEXT416(0x3fc00000);
      local_1dc8 = local_2238._0_8_;
      uVar3 = local_1dc8;
      uStack_1dc0 = local_2238._8_8_;
      local_1dc8._0_4_ = local_2238._0_4_;
      local_1db8 = (ulong)(uint)((float)local_1dc8 * 1.5);
      uStack_1db0 = 0;
      local_1ebc = 0xbf000000;
      local_1ed8 = ZEXT416(0xbf000000);
      local_1de8 = local_1ed8._0_8_;
      uStack_1de0 = 0;
      local_1dd8 = (ulong)(uint)(local_220c * -0.5);
      uStack_1dd0 = 0;
      local_1e08 = local_2238._0_8_;
      uStack_1e00 = local_2238._8_8_;
      local_21ec = local_220c * -0.5 * (float)local_1dc8;
      local_1df8 = (ulong)(uint)local_21ec;
      uStack_1df0 = 0;
      local_1e28 = local_2238._0_8_;
      uStack_1e20 = local_2238._8_8_;
      local_1e18 = CONCAT44(local_2238._4_4_,(float)local_1dc8 * (float)local_1dc8);
      uStack_1e10 = local_2238._8_8_;
      local_1e48 = local_1e18;
      uStack_1e40 = local_2238._8_8_;
      local_21ec = local_21ec * (float)local_1dc8 * (float)local_1dc8;
      local_1e38 = (ulong)(uint)local_21ec;
      uStack_1e30 = 0;
      local_1e68 = local_1e38;
      uStack_1e60 = 0;
      local_21ec = (float)local_1dc8 * 1.5 + local_21ec;
      local_1e58 = (ulong)(uint)local_21ec;
      uStack_1e50 = 0;
      local_2248 = local_1e58;
      uStack_2240 = 0;
      local_20b8 = local_1e58;
      uStack_20b0 = 0;
      local_21d0 = &local_2208;
      local_1ef8 = CONCAT44(local_21ec,local_21ec);
      uStack_1ef0 = CONCAT44(local_21ec,local_21ec);
      uStack_1ee0 = local_808._8_8_;
      local_2158 = fStack_4b4 * local_21ec;
      fStack_2154 = fStack_4b0 * local_21ec;
      fStack_2150 = local_4b8 * local_21ec;
      fStack_214c = auVar18._12_4_ * local_21ec;
      local_3638 = CONCAT44(fStack_2154,local_2158);
      uStack_3630 = CONCAT44(fStack_214c,fStack_2150);
      local_3708 = &local_3a18;
      local_3e0 = local_3a08;
      local_3f0 = &local_39f8;
      uVar1 = *(undefined8 *)&local_35e8->field_0;
      uVar2 = *(undefined8 *)((long)&(in_RDI->dir).field_0 + 8);
      local_3700 = &local_39e8;
      local_3710 = &local_39d8;
      local_3540 = local_3728;
      local_3550 = local_3748;
      local_318 = local_3a08;
      local_3560 = local_3768;
      local_3200 = &local_39f8;
      local_31f0 = &local_3758;
      local_31f8 = local_3768;
      local_26f8 = (float)local_39f8;
      fStack_26f4 = (float)((ulong)local_39f8 >> 0x20);
      fStack_26f0 = (float)uStack_39f0;
      fStack_26ec = (float)((ulong)uStack_39f0 >> 0x20);
      local_31e8 = local_39d0 * local_26f8;
      fStack_31e4 = local_39d0 * fStack_26f4;
      fStack_31e0 = local_39d0 * fStack_26f0;
      fStack_31dc = local_39d0 * fStack_26ec;
      local_31d8 = &local_3758;
      local_308 = &local_3738;
      local_310 = local_3748;
      local_320 = &local_3758;
      local_2f0 = &local_338;
      local_2c8 = (float)local_3a08._0_8_;
      fStack_2c4 = SUB84(local_3a08._0_8_,4);
      fStack_2c0 = (float)local_3a08._8_8_;
      fStack_2bc = SUB84(local_3a08._8_8_,4);
      local_2e8 = local_39d4 * local_2c8;
      fStack_2e4 = local_39d4 * fStack_2c4;
      fStack_2e0 = local_39d4 * fStack_2c0;
      fStack_2dc = local_39d4 * fStack_2bc;
      local_2d0 = &local_338;
      local_78 = CONCAT44(fStack_2e4,local_2e8);
      uStack_70 = CONCAT44(fStack_2dc,fStack_2e0);
      local_b0 = &local_3738;
      local_b8 = &local_338;
      local_88 = (float)local_3758;
      fStack_84 = (float)((ulong)local_3758 >> 0x20);
      fStack_80 = (float)uStack_3750;
      fStack_7c = (float)((ulong)uStack_3750 >> 0x20);
      local_a8 = local_2e8 + local_88;
      fStack_a4 = fStack_2e4 + fStack_84;
      fStack_a0 = fStack_2e0 + fStack_80;
      fStack_9c = fStack_2dc + fStack_7c;
      local_90 = &local_3738;
      local_398 = &local_39e8;
      local_3a0 = local_3728;
      local_3b0 = &local_3738;
      local_380 = &local_3c8;
      local_358 = (float)local_3a18;
      fStack_354 = (float)((ulong)local_3a18 >> 0x20);
      fStack_350 = (float)uStack_3a10;
      fStack_34c = (float)((ulong)uStack_3a10 >> 0x20);
      local_378 = local_39d8 * local_358;
      fStack_374 = local_39d8 * fStack_354;
      fStack_370 = local_39d8 * fStack_350;
      fStack_36c = local_39d8 * fStack_34c;
      local_360 = &local_3c8;
      local_18 = CONCAT44(fStack_374,local_378);
      uStack_10 = CONCAT44(fStack_36c,fStack_370);
      local_50 = &local_39e8;
      local_58 = &local_3c8;
      local_28 = (float)local_3738;
      fStack_24 = (float)((ulong)local_3738 >> 0x20);
      fStack_20 = (float)uStack_3730;
      fStack_1c = (float)((ulong)uStack_3730 >> 0x20);
      local_48 = local_378 + local_28;
      fStack_44 = fStack_374 + fStack_24;
      fStack_40 = fStack_370 + fStack_20;
      fStack_3c = fStack_36c + fStack_1c;
      local_30 = &local_39e8;
      local_39e8 = CONCAT44(fStack_44,local_48);
      uStack_39e0 = CONCAT44(fStack_3c,fStack_40);
      local_3820 = &in_RDI->dir;
      local_3828 = &local_39e8;
      *(undefined8 *)&local_3820->field_0 = local_39e8;
      *(undefined8 *)((long)&(in_RDI->dir).field_0 + 8) = uStack_39e0;
      local_35c0 = local_35c8;
      local_35a0 = local_35a8;
      local_32c0 = local_35c8;
      local_32b8 = local_35c8;
      local_32b0 = local_3440;
      local_3298 = local_3440;
      local_3290 = local_35a8;
      local_3288 = local_35a8;
      local_3280 = local_33e0;
      local_3268 = local_33e0;
      local_3008 = local_3060;
      local_2ff8 = local_3040;
      local_2fb8 = local_3060;
      local_2fa8 = local_3040;
      local_2e00 = local_2fb0;
      local_2dd8 = local_2df0;
      local_2dd0 = local_3000;
      local_2dc8 = local_3060;
      local_2dc0 = local_2df8;
      local_2da8 = local_2df8;
      local_2da0 = local_2fa0;
      local_2d78 = local_2d90;
      local_2d70 = local_2ff0;
      local_2d68 = local_3040;
      local_2d60 = local_2d98;
      local_2d48 = local_2d98;
      local_2d28 = local_2df0;
      local_2d20 = local_2d90;
      local_2d18 = local_3040;
      local_2d10 = local_2ff0;
      local_2cf0 = local_2ff0;
      local_2ce8 = local_3060;
      local_2ce0 = local_3000;
      local_2cc0 = local_3000;
      local_2bf8 = fStack_3274;
      fStack_2bf4 = fStack_3274;
      fStack_2bf0 = fStack_3274;
      fStack_2bec = fStack_3274;
      local_2be8 = uStack_32a4;
      uStack_2be4 = uStack_32a4;
      uStack_2be0 = uStack_32a4;
      uStack_2bdc = uStack_32a4;
      local_2ba8 = local_3078;
      uStack_2ba0 = uStack_3070;
      local_2b98 = local_3058;
      uStack_2b90 = uStack_3050;
      local_2b68 = local_3060;
      local_2b60 = local_3040;
      local_2b58 = local_2ff0;
      local_2b50 = local_3040;
      local_2b48 = local_2fa0;
      local_2b40 = local_2d98;
      local_2b38 = local_3000;
      local_2b30 = local_3060;
      local_2b28 = local_2fb0;
      local_2b20 = local_2df8;
      local_2ab8 = local_3040;
      local_2ab0 = local_2fa0;
      local_2a90 = local_2fa0;
      local_2a88 = fStack_32a0;
      fStack_2a84 = fStack_32a0;
      fStack_2a80 = fStack_32a0;
      fStack_2a7c = fStack_32a0;
      local_2a78 = local_3058;
      uStack_2a70 = uStack_3050;
      local_2a60 = local_3040;
      local_2a58 = local_3060;
      local_2a50 = local_2fb0;
      local_2a30 = local_2fb0;
      local_2a28 = fStack_3270;
      fStack_2a24 = fStack_3270;
      fStack_2a20 = fStack_3270;
      fStack_2a1c = fStack_3270;
      local_2a18 = local_3078;
      uStack_2a10 = uStack_3070;
      local_2a00 = local_3060;
      local_28d8 = local_2d08;
      uStack_28d0 = uStack_2d00;
      local_28c8 = local_3058;
      uStack_28c0 = uStack_3050;
      local_28b8 = local_2aa8;
      uStack_28b0 = uStack_2aa0;
      local_2898 = local_2cd8;
      uStack_2890 = uStack_2cd0;
      local_2888 = local_3078;
      uStack_2880 = uStack_3070;
      local_2878 = local_2a48;
      uStack_2870 = uStack_2a40;
      local_2688 = local_2698;
      uStack_2680 = uStack_2690;
      local_2668 = local_2678;
      uStack_2660 = uStack_2670;
      local_2498 = local_35c8;
      local_2480 = local_35a8;
      local_2408 = local_2698;
      uStack_2400 = uStack_2690;
      local_23f4 = local_2488;
      local_23f0 = local_248c;
      local_23e8 = local_2678;
      uStack_23e0 = uStack_2670;
      local_23d8 = local_249c;
      local_23d0 = local_24a4;
      local_2258 = local_2278;
      local_2250 = local_2278;
      local_21e8 = local_2278;
      local_21e0 = local_2270;
      local_21d4 = local_21ec;
      local_2170 = local_21d0;
      local_2168 = local_2278;
      local_2160 = local_2270;
      local_2148 = local_2270;
      local_2140 = local_2278;
      local_2138 = local_2278;
      local_2130 = local_2178;
      local_2110 = local_2178;
      local_20e8 = local_20f0;
      local_20d8 = local_20f0;
      local_20a0 = local_20d0;
      local_2088 = local_220c;
      local_2078 = local_2090;
      local_2070 = local_20e0;
      local_2068 = local_20f0;
      local_2060 = local_2098;
      local_2048 = local_2098;
      local_2040 = local_2090;
      local_2038 = local_20f0;
      local_2030 = local_20e0;
      local_2010 = local_20e0;
      local_2008 = fStack_2124;
      fStack_2004 = fStack_2124;
      fStack_2000 = fStack_2124;
      fStack_1ffc = fStack_2124;
      local_1ff8 = local_2108;
      uStack_1ff0 = uStack_2100;
      local_1fe0 = local_20f0;
      local_1fd8 = local_20e0;
      local_1fd0 = local_20f0;
      local_1fc8 = local_20d0;
      local_1fc0 = local_2098;
      local_1fb8 = local_20f0;
      local_1fb0 = local_20d0;
      local_1f90 = local_20d0;
      local_1f88 = fStack_2120;
      fStack_1f84 = fStack_2120;
      fStack_1f80 = fStack_2120;
      fStack_1f7c = fStack_2120;
      local_1f78 = local_2108;
      uStack_1f70 = uStack_2100;
      local_1f60 = local_20f0;
      local_1f58 = local_2028;
      uStack_1f50 = uStack_2020;
      local_1f48 = local_2108;
      uStack_1f40 = uStack_2100;
      local_1f38 = local_1fa8;
      uStack_1f30 = uStack_1fa0;
      local_1f18 = auVar18._0_8_;
      local_1f08 = auVar18._0_8_;
      local_1ee8 = auVar18._0_8_;
      local_1e7c = local_220c;
      local_1e78 = local_2228;
      local_1dc8 = uVar3;
      local_1da8 = local_21ec;
      fStack_1da4 = local_21ec;
      fStack_1da0 = local_21ec;
      fStack_1d9c = local_21ec;
      local_1d8c = local_21ec;
      local_1d68 = local_1d88;
      local_1d60 = local_1d88;
      local_1cf8 = local_1d88;
      local_1cf0 = local_1d80;
      local_1ce4 = local_1cfc;
      local_1c80 = local_1ce0;
      local_1c78 = local_1d88;
      local_1c70 = local_1d80;
      local_1c58 = local_1d80;
      local_1c50 = local_1d88;
      local_1c48 = local_1d88;
      local_1c40 = local_1c88;
      local_1c20 = local_1c88;
      local_1bf8 = local_1c00;
      local_1be8 = local_1c00;
      local_1bb0 = local_1be0;
      local_1b98 = local_1d1c;
      local_1b88 = local_1ba0;
      local_1b80 = local_1bf0;
      local_1b78 = local_1c00;
      local_1b70 = local_1ba8;
      local_1b58 = local_1ba8;
      local_1b50 = local_1ba0;
      local_1b48 = local_1c00;
      local_1b40 = local_1bf0;
      local_1b20 = local_1bf0;
      local_1b18 = fStack_1c34;
      fStack_1b14 = fStack_1c34;
      fStack_1b10 = fStack_1c34;
      fStack_1b0c = fStack_1c34;
      local_1b08 = local_1c18;
      uStack_1b00 = uStack_1c10;
      local_1af0 = local_1c00;
      local_1ae8 = local_1bf0;
      local_1ae0 = local_1c00;
      local_1ad8 = local_1be0;
      local_1ad0 = local_1ba8;
      local_1ac8 = local_1c00;
      local_1ac0 = local_1be0;
      local_1aa0 = local_1be0;
      local_1a98 = fStack_1c30;
      fStack_1a94 = fStack_1c30;
      fStack_1a90 = fStack_1c30;
      fStack_1a8c = fStack_1c30;
      local_1a88 = local_1c18;
      uStack_1a80 = uStack_1c10;
      local_1a70 = local_1c00;
      local_1a68 = local_1b38;
      uStack_1a60 = uStack_1b30;
      local_1a58 = local_1c18;
      uStack_1a50 = uStack_1c10;
      local_1a48 = local_1ab8;
      uStack_1a40 = uStack_1ab0;
      local_1a18 = local_1a28;
      uStack_1a10 = uStack_1a20;
      local_19f8 = local_1a28;
      uStack_19f0 = uStack_1a20;
      local_198c = local_1d1c;
      local_1988 = local_1d38;
      local_18d8 = uVar4;
      local_18b8 = local_1cfc;
      fStack_18b4 = local_1cfc;
      fStack_18b0 = local_1cfc;
      fStack_18ac = local_1cfc;
      local_189c = local_1cfc;
      local_e88 = local_1a28;
      uStack_e80 = uStack_1a20;
      local_e70 = local_1d88;
      local_d60 = local_1d80;
      local_d58 = local_35e8;
      local_d50 = local_2278;
      local_d48 = auVar18._0_8_;
      local_d30 = local_2278;
      local_b58 = local_35e8;
      local_b50 = local_2270;
      local_b48 = local_1d80;
      local_b40 = local_3708;
      uStack_a40 = uStack_eb0;
      local_a38 = local_2698;
      uStack_a30 = uStack_2690;
      local_a28 = local_2678;
      uStack_a20 = uStack_2670;
      local_9d8 = local_2698;
      uStack_9d0 = uStack_2690;
      uStack_9c0 = uStack_eb0;
      local_998 = local_2678;
      uStack_990 = uStack_2670;
      uStack_980 = uStack_eb0;
      local_830 = local_cb0;
      local_828 = auVar18._0_8_;
      local_810 = local_cb0;
      local_808 = auVar18;
      local_7e0 = local_838;
      local_7d8 = local_cd0;
      local_7c8 = auVar17._0_8_;
      local_7b0 = local_7d0;
      local_7a8 = auVar17;
      local_798 = local_ce8;
      uStack_790 = uStack_ce0;
      local_780 = local_cd0;
      local_778 = local_cf0;
      local_768 = auVar16._0_8_;
      local_750 = local_770;
      local_748 = auVar16;
      local_720 = local_cf0;
      local_6c8 = local_770;
      local_6c0 = local_d10;
      local_6b8 = local_838;
      local_6b0 = local_770;
      local_6a8 = local_d10;
      local_680 = local_6a0;
      local_678 = local_770;
      local_670 = local_d10;
      local_668 = auVar16._0_8_;
      local_658 = local_d28;
      uStack_650 = uStack_d20;
      local_560 = local_cb8;
      local_558 = local_7d0;
      local_550 = local_6d0;
      local_530 = local_6d0;
      local_528 = local_cb8;
      local_520 = local_7d0;
      local_508 = auVar17._0_8_;
      local_4f0 = local_6d0;
      local_4e8 = local_6a0;
      local_4e0 = local_838;
      fStack_4ac = auVar18._12_4_;
      local_4a8 = local_838;
      local_4a0 = local_6d0;
      local_498 = local_6a0;
      local_3f8 = local_35e8;
      local_3e8 = local_2270;
      local_3d8 = local_1d80;
      local_3d0 = local_3708;
      local_3a8 = local_3708;
      local_390 = local_3708;
      local_388 = local_3a0;
      local_300 = local_318;
      local_2f8 = local_310;
      local_c0 = local_320;
      local_60 = local_3b0;
      local_3a18 = CONCAT44(fStack_1c64,local_1c68);
      uStack_3a10 = CONCAT44(fStack_1c5c,fStack_1c60);
      local_39f8 = uVar1;
      uStack_39f0 = uVar2;
      local_3758 = CONCAT44(fStack_31e4,local_31e8);
      uStack_3750 = CONCAT44(fStack_31dc,fStack_31e0);
      local_3738 = CONCAT44(fStack_a4,local_a8);
      uStack_3730 = CONCAT44(fStack_9c,fStack_a0);
      local_3648 = auVar18._0_8_;
      local_3628 = local_1a28;
      uStack_3620 = uStack_1a20;
      local_3618 = CONCAT44(fStack_1c64,local_1c68);
      uStack_3610 = CONCAT44(fStack_1c5c,fStack_1c60);
      local_3608 = local_2678;
      uStack_3600 = uStack_2670;
      local_35f8 = local_2698;
      uStack_35f0 = uStack_2690;
      local_35d8 = local_3058;
      uStack_35d0 = uStack_3050;
      local_35b8 = local_3078;
      uStack_35b0 = uStack_3070;
      local_3498 = local_28a8;
      uStack_3490 = uStack_28a0;
      local_3488 = local_2f58;
      uStack_3480 = uStack_2f50;
      local_3478 = local_2aa8;
      uStack_3470 = uStack_2aa0;
      local_3468 = local_2d08;
      uStack_3460 = uStack_2d00;
      local_3458 = local_3058;
      uStack_3450 = uStack_3050;
      local_3438 = local_2868;
      uStack_3430 = uStack_2860;
      local_3428 = local_2f68;
      uStack_3420 = uStack_2f60;
      local_3418 = local_2a48;
      uStack_3410 = uStack_2a40;
      local_3408 = local_2cd8;
      uStack_3400 = uStack_2cd0;
      local_33f8 = local_3078;
      uStack_33f0 = uStack_3070;
      local_2268 = local_2108;
      uStack_2260 = uStack_2100;
      local_2208 = local_1ef8;
      uStack_2200 = uStack_1ef0;
      local_21c8 = local_1f28;
      uStack_21c0 = uStack_1f20;
      local_21b8 = local_20c8;
      uStack_21b0 = uStack_20c0;
      local_21a8 = local_1fa8;
      uStack_21a0 = uStack_1fa0;
      local_2198 = local_2028;
      uStack_2190 = uStack_2020;
      local_2188 = local_2108;
      uStack_2180 = uStack_2100;
      local_1d78 = local_1c18;
      uStack_1d70 = uStack_1c10;
      local_1d18 = local_1a08;
      uStack_1d10 = uStack_1a00;
      local_1cd8 = local_1a38;
      uStack_1cd0 = uStack_1a30;
      local_1cc8 = local_1bd8;
      uStack_1cc0 = uStack_1bd0;
      local_1cb8 = local_1ab8;
      uStack_1cb0 = uStack_1ab0;
      local_1ca8 = local_1b38;
      uStack_1ca0 = uStack_1b30;
      local_1c98 = local_1c18;
      uStack_1c90 = uStack_1c10;
      local_df8 = CONCAT44(fStack_544,local_548);
      uStack_df0 = CONCAT44(fStack_53c,fStack_540);
      local_de8 = local_7f8;
      uStack_de0 = uStack_7f0;
      local_dd8 = auVar18._0_8_;
      local_db8 = local_ce8;
      uStack_db0 = uStack_ce0;
      local_da8 = auVar17._0_8_;
      local_d88 = auVar16._0_8_;
      local_d78 = local_d28;
      uStack_d70 = uStack_d20;
      local_6e8 = local_4c8;
      uStack_6e0 = uStack_4c0;
      local_3c8 = local_18;
      uStack_3c0 = uStack_10;
      local_338 = local_78;
      uStack_330 = uStack_70;
      fVar14 = uniformSampleConePDF(local_39c0);
      in_RDI->pdf = fVar14;
      local_3a1c = local_39d0;
      fVar14 = in_RDI->dist;
      local_37e8 = *(float *)(local_3978 + 0x30);
      local_37e0 = -(-local_39d0 * local_39d0 + 1.0) * local_398c + local_37e8 * local_37e8;
      fVar15 = sqrtf(local_37e0);
      in_RDI->dist = local_39d0 * fVar14 + -fVar15;
    }
  }
  return in_RDI;
}

Assistant:

SYCL_EXTERNAL Light_SampleRes PointLight_sample(const Light* super,
                                                               const DifferentialGeometry& dg,
                                                               const Vec2f& s)
{
  const PointLight* self = (PointLight*)super;
  Light_SampleRes res;

  // extant light vector from the hit point
  const Vec3fa dir = self->position - dg.P;
  const float dist2 = dot(dir, dir);
  const float invdist = rsqrt(dist2);

  // normalized light vector
  res.dir = dir * invdist;
  res.dist = dist2 * invdist;

  res.pdf = inf; // per default we always take this res

  // convert from power to radiance by attenuating by distance^2
  res.weight = self->power * sqr(invdist);
  const float sinTheta = self->radius * invdist;

  if ((self->radius > 0.f) & (sinTheta > 0.005f)) {
    // res surface of sphere as seen by hit point -> cone of directions
    // for very small cones treat as point light, because float precision is not good enough
    if (sinTheta < 1.f) {
      const float cosTheta = sqrt(1.f - sinTheta * sinTheta);
      const Vec3fa localDir = uniformSampleCone(cosTheta, s);
      res.dir = frame(res.dir) * localDir;
      res.pdf = uniformSampleConePDF(cosTheta);
      const float c = localDir.z;
      res.dist = c*res.dist - sqrt(sqr(self->radius) - (1.f - c*c) * dist2);
      // TODO scale radiance by actual distance
    } else { // inside sphere
      const Vec3fa localDir = cosineSampleHemisphere(s);
      res.dir = frame(dg.Ns) * localDir;
      res.pdf = cosineSampleHemispherePDF(localDir);
      // TODO:
      res.weight = self->power * rcp(sqr(self->radius));
      res.dist = self->radius;
    }
  }

  return res;
}